

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

int test_bins(void)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  uint3 uVar22;
  undefined1 auVar23 [15];
  unkuint9 Var24;
  undefined1 auVar25 [11];
  undefined1 auVar26 [15];
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  uint uVar36;
  int iVar37;
  byte *pbVar38;
  int64_t extraout_RAX;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  char *unaff_RBP;
  char *pcVar43;
  ulong uVar44;
  int64_t iVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  char *pcVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  long lVar68;
  int iVar77;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar78;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  byte bVar100;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  bool bVar101;
  undefined1 auVar102 [12];
  char cVar118;
  char cVar119;
  char cVar120;
  char cVar121;
  char cVar122;
  char cVar123;
  char cVar124;
  ushort uVar125;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ushort uVar126;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  short sVar133;
  short sVar140;
  short sVar142;
  short sVar144;
  short sVar146;
  short sVar148;
  short sVar150;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  short sVar152;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  short sVar154;
  short sVar161;
  short sVar163;
  short sVar165;
  short sVar167;
  short sVar169;
  short sVar171;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  short sVar173;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  ushort uVar276;
  ushort uVar304;
  undefined1 auVar277 [12];
  ushort uVar300;
  ushort uVar301;
  ushort uVar302;
  ushort uVar303;
  ushort uVar305;
  undefined1 auVar281 [16];
  undefined1 auVar278 [12];
  ushort uVar306;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  byte bVar341;
  ushort uVar342;
  ushort uVar343;
  byte bVar376;
  ushort uVar377;
  ushort uVar378;
  byte bVar379;
  ushort uVar380;
  ushort uVar381;
  byte bVar382;
  ushort uVar383;
  ushort uVar384;
  byte bVar385;
  ushort uVar386;
  ushort uVar387;
  ushort uVar388;
  ushort uVar389;
  undefined1 auVar344 [12];
  ushort uVar390;
  ushort uVar391;
  ushort uVar392;
  ushort uVar393;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar345 [12];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  char head [5];
  char *d4;
  undefined8 local_80;
  uint local_78;
  uint local_74;
  char *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  long lStack_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined6 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [12];
  undefined1 auVar82 [14];
  undefined1 auVar87 [16];
  undefined1 auVar109 [16];
  undefined1 auVar103 [14];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar106 [16];
  undefined1 auVar112 [16];
  short sVar141;
  short sVar143;
  short sVar145;
  short sVar147;
  short sVar149;
  short sVar151;
  short sVar153;
  short sVar162;
  short sVar164;
  short sVar166;
  short sVar168;
  short sVar170;
  short sVar172;
  short sVar174;
  undefined1 auVar279 [14];
  undefined1 auVar280 [14];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar351 [16];
  undefined1 auVar365 [16];
  undefined1 auVar346 [14];
  undefined1 auVar352 [16];
  undefined1 auVar347 [14];
  undefined1 auVar366 [16];
  undefined1 auVar353 [16];
  undefined1 auVar367 [16];
  undefined1 auVar348 [16];
  undefined1 auVar354 [16];
  undefined1 auVar362 [16];
  undefined1 auVar368 [16];
  
  _plan(0x6b,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_bins");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0x01",0xc,1,_stdout);
  fputc(10,_stdout);
  str[0] = 'a';
  buf[1] = -0x3c;
  buf[2] = '\x01';
  buf[3] = 'a';
  pcVar43 = "0x01 == len2";
  _ok(1,"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "len(mp_decode_bin(x, %u))",1);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_00121d3c:
      uVar36 = (uint)(byte)buf[2];
      pcVar43 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_00121d5d:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar43 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_00121d4c;
LAB_00121d74:
      if ((byte)(buf[1] + 0x40U) < 0xe0) {
        test_bins();
        goto LAB_00126e75;
      }
      uVar36 = uVar36 & 0x1f;
      pcVar43 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_00121d5d;
      if (uVar36 != 0xd9) goto LAB_00121d74;
      goto LAB_00121d3c;
    }
LAB_00121d4c:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar43 = buf + 6;
  }
  unaff_RBP = pcVar43 + uVar36;
  _ok((uint)(uVar36 == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x239,
      "len(mp_decode_strbin(x, %u))",1);
  lVar39 = 1;
  pcVar43 = buf + 1;
  do {
    local_80 = (byte *)pcVar43 + 1;
    lVar40 = (long)""[(byte)*pcVar43];
    if (lVar40 < 0) {
      if (*pcVar43 == 0xd9) {
        local_80 = (byte *)pcVar43 + (ulong)((byte *)pcVar43)[1] + 2;
      }
      else {
        if ((byte)""[(byte)*pcVar43] < 0xe1) goto LAB_00126eac;
        lVar39 = lVar39 - lVar40;
      }
    }
    else {
      local_80 = local_80 + lVar40;
    }
    bVar101 = 1 < lVar39;
    lVar39 = lVar39 + -1;
    pcVar43 = (char *)local_80;
  } while (bVar101);
  while( true ) {
    local_70 = buf + 1;
    iVar37 = mp_check(&local_70,(char *)(local_80 + 1));
    uVar53 = 0;
    _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x01)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x239,"mp_check_bin(mp_encode_bin(x, 0x01))");
    pcVar51 = buf + 4;
    _ok((uint)(unaff_RBP == buf + 4),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x239,"len(mp_decode_bin(x, 0x01)");
    _ok((uint)(local_80 == (byte *)(buf + 4)),"d1 == d3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x239,"len(mp_next_bin(x, 0x01)");
    _ok((uint)(local_70 == buf + 4),"d1 == d4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x239,"len(mp_check_bin(x, 0x01)");
    unaff_RBP = (char *)0x1;
    _ok(1,"mp_sizeof_bin(0x01) == (uint32_t) (d1 - data)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x239,"mp_sizeof_bin(0x01)");
    _ok((uint)(str[0] == buf[3]),"memcmp(s1, s2, 0x01) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x239,"mp_encode_bin(x, 0x01) == x");
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("bin len=0x1e",0xc,1,_stdout);
    fputc(10,_stdout);
    iVar37 = (int)DAT_0013f1f0;
    iVar77 = DAT_0013f1f0._4_4_;
    auVar281 = _DAT_0013f1b0;
    do {
      bVar101 = SUB164(auVar281 ^ _DAT_0013f1c0,4) == iVar77 &&
                SUB164(auVar281 ^ _DAT_0013f1c0,0) < iVar37;
      cVar118 = (char)uVar53;
      if (bVar101) {
        cVar119 = cVar118 + -0x1a;
        if (uVar53 < 0x1a) {
          cVar119 = cVar118;
        }
        str[uVar53] = cVar119 + 'a';
      }
      if (bVar101) {
        cVar119 = -0x19;
        if (uVar53 < 0x1a) {
          cVar119 = '\x01';
        }
        str[uVar53 + 1] = cVar119 + cVar118 + 'a';
      }
      uVar53 = uVar53 + 2;
      lVar39 = auVar281._8_8_;
      auVar281._0_8_ = auVar281._0_8_ + 2;
      auVar281._8_8_ = lVar39 + 2;
    } while (uVar53 != 0x1e);
    buf[1] = -0x3c;
    buf[2] = '\x1e';
    buf[3] = (char)str._0_8_;
    buf[4] = SUB81(str._0_8_,1);
    buf[5] = SUB81(str._0_8_,2);
    buf[6] = SUB81(str._0_8_,3);
    buf[7] = SUB81(str._0_8_,4);
    buf[8] = SUB81(str._0_8_,5);
    buf[9] = SUB81(str._0_8_,6);
    buf[10] = SUB81(str._0_8_,7);
    buf[0xb] = str[8];
    buf[0xc] = str[9];
    buf[0xd] = str[10];
    buf[0xe] = str[0xb];
    buf[0xf] = str[0xc];
    buf[0x10] = str[0xd];
    buf[0x11] = str[0xe];
    buf[0x12] = str[0xf];
    buf[0x13] = str[0x10];
    buf[0x14] = str[0x11];
    buf[0x15] = str[0x12];
    buf[0x16] = str[0x13];
    buf[0x17] = str[0x14];
    buf[0x18] = str[0x15];
    buf[0x19] = str[0x16];
    buf[0x1a] = str[0x17];
    buf[0x1b] = str[0x18];
    buf[0x1c] = str[0x19];
    buf[0x1d] = str[0x1a];
    buf[0x1e] = str[0x1b];
    buf[0x1f] = str[0x1c];
    buf[0x20] = str[0x1d];
    pcVar43 = "0x1e == len2";
    _ok(1,"0x1e == len2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x23a,"len(mp_decode_bin(x, %u))",0x1e);
    uVar36 = (uint)(byte)buf[1];
    if (0xd8 < uVar36) break;
    if (uVar36 == 0xc4) {
LAB_001220a7:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
      goto LAB_001220ee;
    }
    if (uVar36 == 0xc5) {
LAB_001220c8:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      goto LAB_001220ee;
    }
    if (uVar36 == 0xc6) goto LAB_001220b7;
LAB_001220d8:
    if (0xdf < (byte)(buf[1] + 0x40U)) {
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
      goto LAB_001220ee;
    }
LAB_00126e75:
    test_bins();
LAB_00126e7a:
    test_bins();
LAB_00126e7f:
    test_bins();
LAB_00126e84:
    test_bins();
LAB_00126e89:
    test_bins();
LAB_00126e8e:
    test_bins();
LAB_00126e93:
    test_bins();
LAB_00126e98:
    test_bins();
LAB_00126e9d:
    test_bins();
LAB_00126ea2:
    test_bins();
LAB_00126ea7:
    test_bins();
    lVar39 = extraout_RAX;
LAB_00126eac:
    local_80 = (byte *)pcVar43;
    mp_next_slowpath((char **)&local_80,lVar39);
  }
  if (uVar36 != 0xdb) {
    if (uVar36 == 0xda) goto LAB_001220c8;
    if (uVar36 != 0xd9) goto LAB_001220d8;
    goto LAB_001220a7;
  }
LAB_001220b7:
  uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
  uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
           CONCAT13(buf[5],uVar22) << 0x18;
  pcVar51 = buf + 6;
LAB_001220ee:
  _ok((uint)(uVar36 == 0x1e),"0x1e == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_decode_strbin(x, %u))",0x1e);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x1e));
  uVar53 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x1e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "mp_check_bin(mp_encode_bin(x, 0x1e))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x21),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_decode_bin(x, 0x1e)");
  _ok((uint)(local_80 == (byte *)(buf + 0x21)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_next_bin(x, 0x1e)");
  _ok((uint)(local_70 == buf + 0x21),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "len(mp_check_bin(x, 0x1e)");
  unaff_RBP = (char *)0x1;
  _ok(1,"mp_sizeof_bin(0x1e) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "mp_sizeof_bin(0x1e)");
  auVar83[0] = -(buf[0x11] == str[0xe]);
  auVar83[1] = -(buf[0x12] == str[0xf]);
  auVar83[2] = -(buf[0x13] == str[0x10]);
  auVar83[3] = -(buf[0x14] == str[0x11]);
  auVar83[4] = -(buf[0x15] == str[0x12]);
  auVar83[5] = -(buf[0x16] == str[0x13]);
  auVar83[6] = -(buf[0x17] == str[0x14]);
  auVar83[7] = -(buf[0x18] == str[0x15]);
  auVar83[8] = -(buf[0x19] == str[0x16]);
  auVar83[9] = -(buf[0x1a] == str[0x17]);
  auVar83[10] = -(buf[0x1b] == str[0x18]);
  auVar83[0xb] = -(buf[0x1c] == str[0x19]);
  auVar83[0xc] = -(buf[0x1d] == str[0x1a]);
  auVar83[0xd] = -(buf[0x1e] == str[0x1b]);
  auVar83[0xe] = -(buf[0x1f] == str[0x1c]);
  auVar83[0xf] = -(buf[0x20] == str[0x1d]);
  auVar57[0] = -(buf[3] == str[0]);
  auVar57[1] = -(buf[4] == str[1]);
  auVar57[2] = -(buf[5] == str[2]);
  auVar57[3] = -(buf[6] == str[3]);
  auVar57[4] = -(buf[7] == str[4]);
  auVar57[5] = -(buf[8] == str[5]);
  auVar57[6] = -(buf[9] == str[6]);
  auVar57[7] = -(buf[10] == str[7]);
  auVar57[8] = -(buf[0xb] == str[8]);
  auVar57[9] = -(buf[0xc] == str[9]);
  auVar57[10] = -(buf[0xd] == str[10]);
  auVar57[0xb] = -(buf[0xe] == str[0xb]);
  auVar57[0xc] = -(buf[0xf] == str[0xc]);
  auVar57[0xd] = -(buf[0x10] == str[0xd]);
  auVar57[0xe] = -(buf[0x11] == str[0xe]);
  auVar57[0xf] = -(buf[0x12] == str[0xf]);
  auVar57 = auVar57 & auVar83;
  _ok((uint)((ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar57[0xf] >> 7) << 0xf) == 0xffff),
      "memcmp(s1, s2, 0x1e) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23a,
      "mp_encode_bin(x, 0x1e) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0x1f",0xc,1,_stdout);
  fputc(10,_stdout);
  auVar281 = _DAT_0013f1c0;
  iVar37 = (int)DAT_0013f200;
  iVar77 = DAT_0013f200._4_4_;
  auVar177 = _DAT_0013f1b0;
  do {
    bVar101 = SUB164(auVar177 ^ auVar281,4) == iVar77 && SUB164(auVar177 ^ auVar281,0) < iVar37;
    cVar118 = (char)uVar53;
    if (bVar101) {
      cVar119 = cVar118 + -0x1a;
      if (uVar53 < 0x1a) {
        cVar119 = cVar118;
      }
      str[uVar53] = cVar119 + 'a';
    }
    if (bVar101) {
      cVar119 = -0x19;
      if (uVar53 < 0x1a) {
        cVar119 = '\x01';
      }
      str[uVar53 + 1] = cVar119 + cVar118 + 'a';
    }
    uVar53 = uVar53 + 2;
    lVar39 = auVar177._8_8_;
    auVar177._0_8_ = auVar177._0_8_ + 2;
    auVar177._8_8_ = lVar39 + 2;
  } while (uVar53 != 0x20);
  buf[1] = -0x3c;
  buf[2] = '\x1f';
  buf[3] = (char)str._0_8_;
  buf[4] = SUB81(str._0_8_,1);
  buf[5] = SUB81(str._0_8_,2);
  buf[6] = SUB81(str._0_8_,3);
  buf[7] = SUB81(str._0_8_,4);
  buf[8] = SUB81(str._0_8_,5);
  buf[9] = SUB81(str._0_8_,6);
  buf[10] = SUB81(str._0_8_,7);
  buf[0xb] = str[8];
  buf[0xc] = str[9];
  buf[0xd] = str[10];
  buf[0xe] = str[0xb];
  buf[0xf] = str[0xc];
  buf[0x10] = str[0xd];
  buf[0x11] = str[0xe];
  buf[0x12] = str[0xf];
  buf[0x13] = str[0x10];
  buf[0x14] = str[0x11];
  buf[0x15] = str[0x12];
  buf[0x16] = str[0x13];
  buf[0x17] = str[0x14];
  buf[0x18] = str[0x15];
  buf[0x19] = str[0x16];
  buf[0x1a] = str[0x17];
  buf[0x1b] = str[0x18];
  buf[0x1c] = str[0x19];
  buf[0x1d] = str[0x1a];
  buf[0x1e] = str[0x1b];
  buf[0x1f] = str[0x1c];
  buf[0x20] = str[0x1d];
  buf[0x21] = str[0x1e];
  pcVar43 = "0x1f == len2";
  _ok(1,"0x1f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_decode_bin(x, %u))",0x1f);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_00122437:
      uVar36 = (uint)(byte)buf[2];
      pcVar43 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_00122458:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar43 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_00122447;
LAB_0012246f:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e7a;
      uVar36 = uVar36 & 0x1f;
      pcVar43 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_00122458;
      if (uVar36 != 0xd9) goto LAB_0012246f;
      goto LAB_00122437;
    }
LAB_00122447:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar43 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x1f),"0x1f == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_decode_strbin(x, %u))",0x1f);
  local_80 = (byte *)(buf + 1);
  iVar45 = 1;
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    local_80 = pbVar38;
    iVar45 = iVar45 + -1;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x1f));
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x1f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "mp_check_bin(mp_encode_bin(x, 0x1f))");
  _ok((uint)(pcVar43 + uVar36 == buf + 0x22),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_decode_bin(x, 0x1f)");
  _ok((uint)(local_80 == (byte *)(buf + 0x22)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_next_bin(x, 0x1f)");
  _ok((uint)(local_70 == buf + 0x22),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "len(mp_check_bin(x, 0x1f)");
  _ok(1,"mp_sizeof_bin(0x1f) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "mp_sizeof_bin(0x1f)");
  auVar84[0] = -(buf[0x12] == str[0xf]);
  auVar84[1] = -(buf[0x13] == str[0x10]);
  auVar84[2] = -(buf[0x14] == str[0x11]);
  auVar84[3] = -(buf[0x15] == str[0x12]);
  auVar84[4] = -(buf[0x16] == str[0x13]);
  auVar84[5] = -(buf[0x17] == str[0x14]);
  auVar84[6] = -(buf[0x18] == str[0x15]);
  auVar84[7] = -(buf[0x19] == str[0x16]);
  auVar84[8] = -(buf[0x1a] == str[0x17]);
  auVar84[9] = -(buf[0x1b] == str[0x18]);
  auVar84[10] = -(buf[0x1c] == str[0x19]);
  auVar84[0xb] = -(buf[0x1d] == str[0x1a]);
  auVar84[0xc] = -(buf[0x1e] == str[0x1b]);
  auVar84[0xd] = -(buf[0x1f] == str[0x1c]);
  auVar84[0xe] = -(buf[0x20] == str[0x1d]);
  auVar84[0xf] = -(buf[0x21] == str[0x1e]);
  auVar58[0] = -(buf[3] == str[0]);
  auVar58[1] = -(buf[4] == str[1]);
  auVar58[2] = -(buf[5] == str[2]);
  auVar58[3] = -(buf[6] == str[3]);
  auVar58[4] = -(buf[7] == str[4]);
  auVar58[5] = -(buf[8] == str[5]);
  auVar58[6] = -(buf[9] == str[6]);
  auVar58[7] = -(buf[10] == str[7]);
  auVar58[8] = -(buf[0xb] == str[8]);
  auVar58[9] = -(buf[0xc] == str[9]);
  auVar58[10] = -(buf[0xd] == str[10]);
  auVar58[0xb] = -(buf[0xe] == str[0xb]);
  auVar58[0xc] = -(buf[0xf] == str[0xc]);
  auVar58[0xd] = -(buf[0x10] == str[0xd]);
  auVar58[0xe] = -(buf[0x11] == str[0xe]);
  auVar58[0xf] = -(buf[0x12] == str[0xf]);
  auVar58 = auVar58 & auVar84;
  _ok((uint)((ushort)((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar58[0xf] >> 7) << 0xf) == 0xffff),
      "memcmp(s1, s2, 0x1f) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23b,
      "mp_encode_bin(x, 0x1f) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0x20",0xc,1,_stdout);
  fputc(10,_stdout);
  builtin_strncpy(str,"abcdefghijklmnopqrstuvwxyzabcdef",0x20);
  buf[1] = -0x3c;
  buf[2] = ' ';
  buf[3] = 'a';
  buf[4] = 'b';
  buf[5] = 'c';
  buf[6] = 'd';
  buf[7] = 'e';
  buf[8] = 'f';
  buf[9] = 'g';
  buf[10] = 'h';
  buf[0xb] = 'i';
  buf[0xc] = 'j';
  buf[0xd] = 'k';
  buf[0xe] = 'l';
  buf[0xf] = 'm';
  buf[0x10] = 'n';
  buf[0x11] = 'o';
  buf[0x12] = 'p';
  buf[0x13] = 'q';
  buf[0x14] = 'r';
  buf[0x15] = 's';
  buf[0x16] = 't';
  buf[0x17] = 'u';
  buf[0x18] = 'v';
  buf[0x19] = 'w';
  buf[0x1a] = 'x';
  buf[0x1b] = 'y';
  buf[0x1c] = 'z';
  buf[0x1d] = 'a';
  buf[0x1e] = 'b';
  buf[0x1f] = 'c';
  buf[0x20] = 'd';
  buf[0x21] = 'e';
  buf[0x22] = 'f';
  pcVar43 = "0x20 == len2";
  _ok(1,"0x20 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_decode_bin(x, %u))",0x20);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0012273a:
      uVar36 = (uint)(byte)buf[2];
      pcVar43 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0012275b:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar43 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0012274a;
LAB_00122772:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e7f;
      uVar36 = uVar36 & 0x1f;
      pcVar43 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0012275b;
      if (uVar36 != 0xd9) goto LAB_00122772;
      goto LAB_0012273a;
    }
LAB_0012274a:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar43 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x20),"0x20 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_decode_strbin(x, %u))",0x20);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x20));
  lVar40 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x20)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "mp_check_bin(mp_encode_bin(x, 0x20))");
  _ok((uint)(pcVar43 + uVar36 == buf + 0x23),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_decode_bin(x, 0x20)");
  _ok((uint)(local_80 == (byte *)(buf + 0x23)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_next_bin(x, 0x20)");
  _ok((uint)(local_70 == buf + 0x23),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "len(mp_check_bin(x, 0x20)");
  _ok(1,"mp_sizeof_bin(0x20) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "mp_sizeof_bin(0x20)");
  auVar59[0] = -(buf[0x13] == str[0x10]);
  auVar59[1] = -(buf[0x14] == str[0x11]);
  auVar59[2] = -(buf[0x15] == str[0x12]);
  auVar59[3] = -(buf[0x16] == str[0x13]);
  auVar59[4] = -(buf[0x17] == str[0x14]);
  auVar59[5] = -(buf[0x18] == str[0x15]);
  auVar59[6] = -(buf[0x19] == str[0x16]);
  auVar59[7] = -(buf[0x1a] == str[0x17]);
  auVar59[8] = -(buf[0x1b] == str[0x18]);
  auVar59[9] = -(buf[0x1c] == str[0x19]);
  auVar59[10] = -(buf[0x1d] == str[0x1a]);
  auVar59[0xb] = -(buf[0x1e] == str[0x1b]);
  auVar59[0xc] = -(buf[0x1f] == str[0x1c]);
  auVar59[0xd] = -(buf[0x20] == str[0x1d]);
  auVar59[0xe] = -(buf[0x21] == str[0x1e]);
  auVar59[0xf] = -(buf[0x22] == str[0x1f]);
  auVar69[0] = -(buf[3] == str[0]);
  auVar69[1] = -(buf[4] == str[1]);
  auVar69[2] = -(buf[5] == str[2]);
  auVar69[3] = -(buf[6] == str[3]);
  auVar69[4] = -(buf[7] == str[4]);
  auVar69[5] = -(buf[8] == str[5]);
  auVar69[6] = -(buf[9] == str[6]);
  auVar69[7] = -(buf[10] == str[7]);
  auVar69[8] = -(buf[0xb] == str[8]);
  auVar69[9] = -(buf[0xc] == str[9]);
  auVar69[10] = -(buf[0xd] == str[10]);
  auVar69[0xb] = -(buf[0xe] == str[0xb]);
  auVar69[0xc] = -(buf[0xf] == str[0xc]);
  auVar69[0xd] = -(buf[0x10] == str[0xd]);
  auVar69[0xe] = -(buf[0x11] == str[0xe]);
  auVar69[0xf] = -(buf[0x12] == str[0xf]);
  auVar69 = auVar69 & auVar59;
  _ok((uint)((ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar69[0xf] >> 7) << 0xf) == 0xffff),
      "memcmp(s1, s2, 0x20) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23c,
      "mp_encode_bin(x, 0x20) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0xfe",0xc,1,_stdout);
  fputc(10,_stdout);
  lVar68 = 0xc;
  auVar60 = _DAT_0013f230;
  auVar85 = _DAT_0013f250;
  auVar104 = _DAT_0013f260;
  auVar127 = _DAT_0013f270;
  auVar134 = _DAT_0013f280;
  auVar155 = _DAT_0013f290;
  auVar175 = _DAT_0013f1b0;
  auVar186 = _DAT_0013f2a0;
  lVar39 = 0xd;
  do {
    lStack_60 = lVar39;
    local_68._0_2_ = (undefined2)lVar68;
    local_68._2_2_ = (undefined2)((ulong)lVar68 >> 0x10);
    uStack_64 = (undefined4)((ulong)lVar68 >> 0x20);
    auVar281 = auVar175 ^ _DAT_0013f1c0;
    auVar325._0_4_ = -(uint)(auVar281._0_4_ < -0x7fffff02);
    auVar325._4_4_ = -(uint)(auVar281._0_4_ < -0x7fffff02);
    auVar325._8_4_ = -(uint)(auVar281._8_4_ < -0x7fffff02);
    auVar325._12_4_ = -(uint)(auVar281._8_4_ < -0x7fffff02);
    auVar307._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar307._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar307._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar307._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar307 = auVar307 & auVar325;
    auVar281 = pshuflw(auVar325,auVar307,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    bVar93 = auVar186[8];
    bVar94 = auVar186[9];
    bVar95 = auVar186[10];
    bVar96 = auVar186[0xb];
    bVar97 = auVar186[0xc];
    bVar98 = auVar186[0xd];
    bVar99 = auVar186[0xe];
    bVar100 = auVar186[0xf];
    uVar276 = (ushort)((ushort)bVar93 * 0x4f) >> 8;
    uVar300 = (ushort)((ushort)bVar94 * 0x4f) >> 8;
    uVar301 = (ushort)((ushort)bVar95 * 0x4f) >> 8;
    uVar302 = (ushort)((ushort)bVar96 * 0x4f) >> 8;
    uVar303 = (ushort)((ushort)bVar97 * 0x4f) >> 8;
    uVar304 = (ushort)((ushort)bVar98 * 0x4f) >> 8;
    uVar305 = (ushort)((ushort)bVar99 * 0x4f) >> 8;
    uVar306 = (ushort)((ushort)bVar100 * 0x4f) >> 8;
    cVar124 = auVar186[7];
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar186._0_13_;
    auVar1[0xe] = cVar124;
    cVar123 = auVar186[6];
    auVar4[0xc] = cVar123;
    auVar4._0_12_ = auVar186._0_12_;
    auVar4._13_2_ = auVar1._13_2_;
    auVar7[0xb] = 0;
    auVar7._0_11_ = auVar186._0_11_;
    auVar7._12_3_ = auVar4._12_3_;
    cVar122 = auVar186[5];
    auVar10[10] = cVar122;
    auVar10._0_10_ = auVar186._0_10_;
    auVar10._11_4_ = auVar7._11_4_;
    auVar13[9] = 0;
    auVar13._0_9_ = auVar186._0_9_;
    auVar13._10_5_ = auVar10._10_5_;
    cVar121 = auVar186[4];
    auVar16[8] = cVar121;
    auVar16._0_8_ = auVar186._0_8_;
    auVar16._9_6_ = auVar13._9_6_;
    auVar23._7_8_ = 0;
    auVar23._0_7_ = auVar16._8_7_;
    cVar120 = auVar186[3];
    Var24 = CONCAT81(SUB158(auVar23 << 0x40,7),cVar120);
    auVar30._9_6_ = 0;
    auVar30._0_9_ = Var24;
    cVar119 = auVar186[2];
    auVar25._1_10_ = SUB1510(auVar30 << 0x30,5);
    auVar25[0] = cVar119;
    auVar31._11_4_ = 0;
    auVar31._0_11_ = auVar25;
    cVar118 = auVar186[1];
    auVar19[2] = cVar118;
    auVar19._0_2_ = auVar186._0_2_;
    auVar19._3_12_ = SUB1512(auVar31 << 0x20,3);
    uVar342 = (auVar186._0_2_ & 0xff) * 0x4f;
    uVar377 = auVar19._2_2_ * 0x4f;
    uVar380 = auVar25._0_2_ * 0x4f;
    uVar383 = (short)Var24 * 0x4f;
    uVar386 = auVar16._8_2_ * 0x4f;
    uVar388 = auVar10._10_2_ * 0x4f;
    uVar390 = auVar4._12_2_ * 0x4f;
    uVar392 = (auVar1._13_2_ >> 8) * 0x4f;
    uVar343 = uVar342 >> 8;
    uVar378 = uVar377 >> 8;
    uVar381 = uVar380 >> 8;
    uVar384 = uVar383 >> 8;
    uVar387 = uVar386 >> 8;
    uVar389 = uVar388 >> 8;
    uVar391 = uVar390 >> 8;
    uVar393 = uVar392 >> 8;
    uVar342 = CONCAT11((uVar378 != 0) * (uVar378 < 0x100) * (char)(uVar377 >> 8) - (0xff < uVar378),
                       (uVar343 != 0) * (uVar343 < 0x100) * (char)(uVar342 >> 8) - (0xff < uVar343))
    ;
    uVar78 = CONCAT13((uVar384 != 0) * (uVar384 < 0x100) * (char)(uVar383 >> 8) - (0xff < uVar384),
                      CONCAT12((uVar381 != 0) * (uVar381 < 0x100) * (char)(uVar380 >> 8) -
                               (0xff < uVar381),uVar342));
    uVar79 = CONCAT15((uVar389 != 0) * (uVar389 < 0x100) * (char)(uVar388 >> 8) - (0xff < uVar389),
                      CONCAT14((uVar387 != 0) * (uVar387 < 0x100) * (char)(uVar386 >> 8) -
                               (0xff < uVar387),uVar78));
    uVar80 = CONCAT17((uVar393 != 0) * (uVar393 < 0x100) * (char)(uVar392 >> 8) - (0xff < uVar393),
                      CONCAT16((uVar391 != 0) * (uVar391 < 0x100) * (char)(uVar390 >> 8) -
                               (0xff < uVar391),uVar79));
    auVar344._0_10_ =
         CONCAT19((uVar300 != 0) * (uVar300 < 0x100) * (char)((ushort)((ushort)bVar94 * 0x4f) >> 8)
                  - (0xff < uVar300),
                  CONCAT18((uVar276 != 0) * (uVar276 < 0x100) *
                           (char)((ushort)((ushort)bVar93 * 0x4f) >> 8) - (0xff < uVar276),uVar80));
    auVar344[10] = (uVar301 != 0) * (uVar301 < 0x100) * (char)((ushort)((ushort)bVar95 * 0x4f) >> 8)
                   - (0xff < uVar301);
    auVar344[0xb] =
         (uVar302 != 0) * (uVar302 < 0x100) * (char)((ushort)((ushort)bVar96 * 0x4f) >> 8) -
         (0xff < uVar302);
    auVar346[0xc] =
         (uVar303 != 0) * (uVar303 < 0x100) * (char)((ushort)((ushort)bVar97 * 0x4f) >> 8) -
         (0xff < uVar303);
    auVar346._0_12_ = auVar344;
    auVar346[0xd] =
         (uVar304 != 0) * (uVar304 < 0x100) * (char)((ushort)((ushort)bVar98 * 0x4f) >> 8) -
         (0xff < uVar304);
    auVar348[0xe] =
         (uVar305 != 0) * (uVar305 < 0x100) * (char)((ushort)((ushort)bVar99 * 0x4f) >> 8) -
         (0xff < uVar305);
    auVar348._0_14_ = auVar346;
    auVar348[0xf] =
         (uVar306 != 0) * (uVar306 < 0x100) * (char)((ushort)((ushort)bVar100 * 0x4f) >> 8) -
         (0xff < uVar306);
    auVar349._0_2_ = uVar342 >> 3;
    auVar349._2_2_ = (ushort)((uint)uVar78 >> 0x13);
    auVar349._4_2_ = (ushort)((uint6)uVar79 >> 0x23);
    auVar349._6_2_ = (ushort)((ulong)uVar80 >> 0x33);
    auVar349._8_2_ = (ushort)((unkuint10)auVar344._0_10_ >> 0x43);
    auVar349._10_2_ = auVar344._10_2_ >> 3;
    auVar349._12_2_ = auVar346._12_2_ >> 3;
    auVar349._14_2_ = auVar348._14_2_ >> 3;
    auVar349 = auVar349 & _DAT_0013f2d0;
    sVar133 = CONCAT11(auVar349[8],auVar349[8]);
    uVar78 = CONCAT13(auVar349[9],CONCAT12(auVar349[9],sVar133));
    uVar79 = CONCAT15(auVar349[10],CONCAT14(auVar349[10],uVar78));
    uVar80 = CONCAT17(auVar349[0xb],CONCAT16(auVar349[0xb],uVar79));
    auVar277._0_10_ = CONCAT19(auVar349[0xc],CONCAT18(auVar349[0xc],uVar80));
    auVar277[10] = auVar349[0xd];
    auVar277[0xb] = auVar349[0xd];
    auVar279[0xc] = auVar349[0xe];
    auVar279._0_12_ = auVar277;
    auVar279[0xd] = auVar349[0xe];
    auVar282[0xf] = auVar349[0xf];
    auVar282[0xe] = auVar282[0xf];
    auVar282._0_14_ = auVar279;
    uVar276 = sVar133 * 0x1a;
    uVar301 = (short)((uint)uVar78 >> 0x10) * 0x1a;
    uVar303 = (short)((uint6)uVar79 >> 0x20) * 0x1a;
    uVar305 = (short)((ulong)uVar80 >> 0x30) * 0x1a;
    uVar342 = (short)((unkuint10)auVar277._0_10_ >> 0x40) * 0x1a;
    uVar377 = auVar277._10_2_ * 0x1a;
    uVar380 = auVar279._12_2_ * 0x1a;
    uVar383 = auVar282._14_2_ * 0x1a;
    uVar300 = uVar276 & 0xff;
    uVar302 = uVar301 & 0xff;
    uVar304 = uVar303 & 0xff;
    uVar306 = uVar305 & 0xff;
    uVar343 = uVar342 & 0xff;
    uVar378 = uVar377 & 0xff;
    uVar381 = uVar380 & 0xff;
    uVar384 = uVar383 & 0xff;
    auVar354._0_14_ = auVar349._0_14_;
    auVar354[0xe] = auVar349[7];
    auVar354[0xf] = auVar349[7];
    auVar353._14_2_ = auVar354._14_2_;
    auVar353._0_13_ = auVar349._0_13_;
    auVar353[0xd] = auVar349[6];
    auVar352._13_3_ = auVar353._13_3_;
    auVar352._0_12_ = auVar349._0_12_;
    auVar352[0xc] = auVar349[6];
    auVar351._12_4_ = auVar352._12_4_;
    auVar351._0_11_ = auVar349._0_11_;
    auVar351[0xb] = auVar349[5];
    auVar350._11_5_ = auVar351._11_5_;
    auVar350._0_10_ = auVar349._0_10_;
    auVar350[10] = auVar349[5];
    bVar341 = auVar349[0] * '\x1a';
    bVar376 = auVar349[1] * '\x1a';
    bVar379 = auVar349[2] * '\x1a';
    bVar382 = auVar349[3] * '\x1a';
    bVar385 = auVar349[4] * '\x1a';
    uVar391 = auVar350._10_2_ * 0x1a;
    uVar393 = auVar352._12_2_ * 0x1a;
    uVar386 = (ushort)bVar341;
    uVar387 = (ushort)bVar376;
    uVar388 = (ushort)bVar379;
    uVar389 = (ushort)bVar382;
    uVar390 = (ushort)bVar385;
    uVar392 = uVar391 & 0xff;
    uVar125 = uVar393 & 0xff;
    uVar126 = auVar353._14_2_ * 0x1a & 0xff;
    if ((auVar281 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40] = (auVar186[0] - ((uVar386 != 0) * (uVar386 < 0x100) * bVar341 - (0xff < uVar386))
                    ) + 'a';
    }
    auVar281 = packssdw(auVar307,auVar307);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._0_4_ >> 8 & 1) != 0) {
      str[lVar40 + 1] =
           (cVar118 - ((uVar387 != 0) * (uVar387 < 0x100) * bVar376 - (0xff < uVar387))) + 'a';
    }
    auVar281 = auVar155 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar326._4_4_ = iVar37;
    auVar326._0_4_ = iVar37;
    auVar326._8_4_ = iVar77;
    auVar326._12_4_ = iVar77;
    auVar355._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar355._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar355._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar355._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar308._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar308._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar308._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar308._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar308 = auVar308 & auVar355;
    auVar281 = packssdw(auVar326,auVar308);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._0_4_ >> 0x10 & 1) != 0) {
      str[lVar40 + 2] =
           (cVar119 - ((uVar388 != 0) * (uVar388 < 0x100) * bVar379 - (0xff < uVar388))) + 'a';
    }
    auVar281 = pshufhw(auVar308,auVar308,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    auVar313._8_8_ = lStack_60;
    auVar313._0_8_ = lVar68;
    if ((auVar281._0_4_ >> 0x18 & 1) != 0) {
      str[lVar40 + 3] =
           (cVar120 - ((uVar389 != 0) * (uVar389 < 0x100) * bVar382 - (0xff < uVar389))) + 'a';
    }
    auVar281 = auVar134 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar327._4_4_ = iVar37;
    auVar327._0_4_ = iVar37;
    auVar327._8_4_ = iVar77;
    auVar327._12_4_ = iVar77;
    auVar356._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar356._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar356._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar356._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar309._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar309._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar309._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar309._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar309 = auVar309 & auVar356;
    auVar281 = pshuflw(auVar327,auVar309,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 4] =
           (cVar121 - ((uVar390 != 0) * (uVar390 < 0x100) * bVar385 - (0xff < uVar390))) + 'a';
    }
    auVar281 = packssdw(auVar309,auVar309);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._4_2_ >> 8 & 1) != 0) {
      str[lVar40 + 5] =
           (cVar122 - ((uVar392 != 0) * (uVar392 < 0x100) * (char)uVar391 - (0xff < uVar392))) + 'a'
      ;
    }
    auVar281 = auVar127 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar328._4_4_ = iVar37;
    auVar328._0_4_ = iVar37;
    auVar328._8_4_ = iVar77;
    auVar328._12_4_ = iVar77;
    auVar357._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar357._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar357._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar357._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar310._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar310._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar310._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar310._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar310 = auVar310 & auVar357;
    auVar281 = packssdw(auVar328,auVar310);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 6] =
           (cVar123 - ((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar393 - (0xff < uVar125))) + 'a'
      ;
    }
    auVar281 = pshufhw(auVar310,auVar310,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._6_2_ >> 8 & 1) != 0) {
      str[lVar40 + 7] =
           (cVar124 -
           ((uVar126 != 0) * (uVar126 < 0x100) * (char)(auVar353._14_2_ * 0x1a) - (0xff < uVar126)))
           + 'a';
    }
    auVar281 = auVar104 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar329._4_4_ = iVar37;
    auVar329._0_4_ = iVar37;
    auVar329._8_4_ = iVar77;
    auVar329._12_4_ = iVar77;
    auVar358._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar358._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar358._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar358._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar311._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar311._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar311._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar311._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar311 = auVar311 & auVar358;
    auVar281 = pshuflw(auVar329,auVar311,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40 + 8] =
           (bVar93 - ((uVar300 != 0) * (uVar300 < 0x100) * (char)uVar276 - (0xff < uVar300))) + 'a';
    }
    auVar281 = packssdw(auVar311,auVar311);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._8_2_ >> 8 & 1) != 0) {
      str[lVar40 + 9] =
           (bVar94 - ((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar301 - (0xff < uVar302))) + 'a';
    }
    auVar281 = auVar85 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar330._4_4_ = iVar37;
    auVar330._0_4_ = iVar37;
    auVar330._8_4_ = iVar77;
    auVar330._12_4_ = iVar77;
    auVar359._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar359._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar359._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar359._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar312._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar312._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar312._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar312._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar312 = auVar312 & auVar359;
    auVar281 = packssdw(auVar330,auVar312);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar40 + 10] =
           (bVar95 - ((uVar304 != 0) * (uVar304 < 0x100) * (char)uVar303 - (0xff < uVar304))) + 'a';
    }
    auVar281 = pshufhw(auVar312,auVar312,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._10_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xb] =
           (bVar96 - ((uVar306 != 0) * (uVar306 < 0x100) * (char)uVar305 - (0xff < uVar306))) + 'a';
    }
    auVar313 = auVar313 ^ _DAT_0013f1c0;
    iVar37 = auVar313._0_4_;
    iVar77 = auVar313._8_4_;
    auVar331._4_4_ = iVar37;
    auVar331._0_4_ = iVar37;
    auVar331._8_4_ = iVar77;
    auVar331._12_4_ = iVar77;
    auVar360._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar360._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar360._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar360._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar314._0_4_ = -(uint)(auVar313._4_4_ == -0x80000000);
    auVar314._4_4_ = -(uint)(auVar313._4_4_ == -0x80000000);
    auVar314._8_4_ = -(uint)(auVar313._12_4_ == -0x80000000);
    auVar314._12_4_ = -(uint)(auVar313._12_4_ == -0x80000000);
    auVar314 = auVar314 & auVar360;
    auVar281 = pshuflw(auVar331,auVar314,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xc] =
           (bVar97 - ((uVar343 != 0) * (uVar343 < 0x100) * (char)uVar342 - (0xff < uVar343))) + 'a';
    }
    auVar281 = packssdw(auVar314,auVar314);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._12_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xd] =
           (bVar98 - ((uVar378 != 0) * (uVar378 < 0x100) * (char)uVar377 - (0xff < uVar378))) + 'a';
    }
    auVar281 = auVar60 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar332._4_4_ = iVar37;
    auVar332._0_4_ = iVar37;
    auVar332._8_4_ = iVar77;
    auVar332._12_4_ = iVar77;
    auVar361._0_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar361._4_4_ = -(uint)(iVar37 < -0x7fffff02);
    auVar361._8_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar361._12_4_ = -(uint)(iVar77 < -0x7fffff02);
    auVar315._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar315._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar315._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar315._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar315 = auVar315 & auVar361;
    auVar281 = packssdw(auVar332,auVar315);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xe] =
           (bVar99 - ((uVar381 != 0) * (uVar381 < 0x100) * (char)uVar380 - (0xff < uVar381))) + 'a';
    }
    auVar281 = pshufhw(auVar315,auVar315,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._14_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xf] =
           (bVar100 - ((uVar384 != 0) * (uVar384 < 0x100) * (char)uVar383 - (0xff < uVar384))) + 'a'
      ;
    }
    lVar40 = lVar40 + 0x10;
    lVar39 = auVar175._8_8_;
    auVar175._0_8_ = auVar175._0_8_ + 0x10;
    auVar175._8_8_ = lVar39 + 0x10;
    lVar39 = auVar155._8_8_;
    auVar155._0_8_ = auVar155._0_8_ + 0x10;
    auVar155._8_8_ = lVar39 + 0x10;
    lVar39 = auVar134._8_8_;
    auVar134._0_8_ = auVar134._0_8_ + 0x10;
    auVar134._8_8_ = lVar39 + 0x10;
    lVar39 = auVar127._8_8_;
    auVar127._0_8_ = auVar127._0_8_ + 0x10;
    auVar127._8_8_ = lVar39 + 0x10;
    lVar39 = auVar104._8_8_;
    auVar104._0_8_ = auVar104._0_8_ + 0x10;
    auVar104._8_8_ = lVar39 + 0x10;
    lVar39 = auVar85._8_8_;
    auVar85._0_8_ = auVar85._0_8_ + 0x10;
    auVar85._8_8_ = lVar39 + 0x10;
    lVar68 = lVar68 + 0x10;
    lVar39 = auVar60._8_8_;
    auVar60._0_8_ = auVar60._0_8_ + 0x10;
    auVar60._8_8_ = lVar39 + 0x10;
    auVar186[0] = auVar186[0] + '\x10';
    auVar186[1] = cVar118 + '\x10';
    auVar186[2] = cVar119 + '\x10';
    auVar186[3] = cVar120 + '\x10';
    auVar186[4] = cVar121 + '\x10';
    auVar186[5] = cVar122 + '\x10';
    auVar186[6] = cVar123 + '\x10';
    auVar186[7] = cVar124 + '\x10';
    auVar186[8] = bVar93 + 0x10;
    auVar186[9] = bVar94 + 0x10;
    auVar186[10] = bVar95 + 0x10;
    auVar186[0xb] = bVar96 + 0x10;
    auVar186[0xc] = bVar97 + 0x10;
    auVar186[0xd] = bVar98 + 0x10;
    auVar186[0xe] = bVar99 + 0x10;
    auVar186[0xf] = bVar100 + 0x10;
    lVar39 = lStack_60 + 0x10;
  } while (lVar40 != 0x100);
  buf[1] = -0x3c;
  buf[2] = -2;
  pcVar51 = buf + 3;
  unaff_RBP = str;
  memcpy(buf + 3,str,0xfe);
  pcVar43 = "0xfe == len2";
  _ok(1,"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_decode_bin(x, %u))",0xfe);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_00122f5a:
      uVar36 = (uint)(byte)buf[2];
    }
    else if (uVar36 == 0xc5) {
LAB_00122f74:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar51 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_00122f63;
LAB_00122f8b:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e84;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_00122f74;
      if (uVar36 != 0xd9) goto LAB_00122f8b;
      goto LAB_00122f5a;
    }
LAB_00122f63:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0xfe),"0xfe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_decode_strbin(x, %u))",0xfe);
  local_80 = (byte *)(buf + 1);
  iVar45 = 1;
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    local_80 = pbVar38;
    iVar45 = iVar45 + -1;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xfe));
  lVar40 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xfe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "mp_check_bin(mp_encode_bin(x, 0xfe))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x101),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_decode_bin(x, 0xfe)");
  _ok((uint)(local_80 == (byte *)(buf + 0x101)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_next_bin(x, 0xfe)");
  _ok((uint)(local_70 == buf + 0x101),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "len(mp_check_bin(x, 0xfe)");
  _ok(1,"mp_sizeof_bin(0xfe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "mp_sizeof_bin(0xfe)");
  iVar37 = bcmp(str,buf + 3,0xfe);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xfe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23d,
      "mp_encode_bin(x, 0xfe) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0xff",0xc,1,_stdout);
  fputc(10,_stdout);
  lVar68 = 0xe;
  auVar70 = _DAT_0013f240;
  auVar86 = _DAT_0013f250;
  auVar105 = _DAT_0013f260;
  auVar128 = _DAT_0013f270;
  auVar135 = _DAT_0013f280;
  auVar156 = _DAT_0013f290;
  auVar176 = _DAT_0013f1b0;
  auVar187 = _DAT_0013f2a0;
  lVar39 = 0xf;
  do {
    lStack_60 = lVar39;
    local_68._0_2_ = (undefined2)lVar68;
    local_68._2_2_ = (undefined2)((ulong)lVar68 >> 0x10);
    uStack_64 = (undefined4)((ulong)lVar68 >> 0x20);
    auVar281 = auVar176 ^ _DAT_0013f1c0;
    auVar333._0_4_ = -(uint)(auVar281._0_4_ < -0x7fffff01);
    auVar333._4_4_ = -(uint)(auVar281._0_4_ < -0x7fffff01);
    auVar333._8_4_ = -(uint)(auVar281._8_4_ < -0x7fffff01);
    auVar333._12_4_ = -(uint)(auVar281._8_4_ < -0x7fffff01);
    auVar316._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar316._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar316._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar316._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar316 = auVar316 & auVar333;
    auVar281 = pshuflw(auVar333,auVar316,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    bVar93 = auVar187[8];
    bVar94 = auVar187[9];
    bVar95 = auVar187[10];
    bVar96 = auVar187[0xb];
    bVar97 = auVar187[0xc];
    bVar98 = auVar187[0xd];
    bVar99 = auVar187[0xe];
    bVar100 = auVar187[0xf];
    uVar276 = (ushort)((ushort)bVar93 * 0x4f) >> 8;
    uVar300 = (ushort)((ushort)bVar94 * 0x4f) >> 8;
    uVar301 = (ushort)((ushort)bVar95 * 0x4f) >> 8;
    uVar302 = (ushort)((ushort)bVar96 * 0x4f) >> 8;
    uVar303 = (ushort)((ushort)bVar97 * 0x4f) >> 8;
    uVar304 = (ushort)((ushort)bVar98 * 0x4f) >> 8;
    uVar305 = (ushort)((ushort)bVar99 * 0x4f) >> 8;
    uVar306 = (ushort)((ushort)bVar100 * 0x4f) >> 8;
    cVar124 = auVar187[7];
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar187._0_13_;
    auVar2[0xe] = cVar124;
    cVar123 = auVar187[6];
    auVar5[0xc] = cVar123;
    auVar5._0_12_ = auVar187._0_12_;
    auVar5._13_2_ = auVar2._13_2_;
    auVar8[0xb] = 0;
    auVar8._0_11_ = auVar187._0_11_;
    auVar8._12_3_ = auVar5._12_3_;
    cVar122 = auVar187[5];
    auVar11[10] = cVar122;
    auVar11._0_10_ = auVar187._0_10_;
    auVar11._11_4_ = auVar8._11_4_;
    auVar14[9] = 0;
    auVar14._0_9_ = auVar187._0_9_;
    auVar14._10_5_ = auVar11._10_5_;
    cVar121 = auVar187[4];
    auVar17[8] = cVar121;
    auVar17._0_8_ = auVar187._0_8_;
    auVar17._9_6_ = auVar14._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar17._8_7_;
    cVar120 = auVar187[3];
    Var24 = CONCAT81(SUB158(auVar26 << 0x40,7),cVar120);
    auVar32._9_6_ = 0;
    auVar32._0_9_ = Var24;
    cVar119 = auVar187[2];
    auVar27._1_10_ = SUB1510(auVar32 << 0x30,5);
    auVar27[0] = cVar119;
    auVar33._11_4_ = 0;
    auVar33._0_11_ = auVar27;
    cVar118 = auVar187[1];
    auVar20[2] = cVar118;
    auVar20._0_2_ = auVar187._0_2_;
    auVar20._3_12_ = SUB1512(auVar33 << 0x20,3);
    uVar342 = (auVar187._0_2_ & 0xff) * 0x4f;
    uVar377 = auVar20._2_2_ * 0x4f;
    uVar380 = auVar27._0_2_ * 0x4f;
    uVar383 = (short)Var24 * 0x4f;
    uVar386 = auVar17._8_2_ * 0x4f;
    uVar388 = auVar11._10_2_ * 0x4f;
    uVar390 = auVar5._12_2_ * 0x4f;
    uVar392 = (auVar2._13_2_ >> 8) * 0x4f;
    uVar343 = uVar342 >> 8;
    uVar378 = uVar377 >> 8;
    uVar381 = uVar380 >> 8;
    uVar384 = uVar383 >> 8;
    uVar387 = uVar386 >> 8;
    uVar389 = uVar388 >> 8;
    uVar391 = uVar390 >> 8;
    uVar393 = uVar392 >> 8;
    uVar342 = CONCAT11((uVar378 != 0) * (uVar378 < 0x100) * (char)(uVar377 >> 8) - (0xff < uVar378),
                       (uVar343 != 0) * (uVar343 < 0x100) * (char)(uVar342 >> 8) - (0xff < uVar343))
    ;
    uVar78 = CONCAT13((uVar384 != 0) * (uVar384 < 0x100) * (char)(uVar383 >> 8) - (0xff < uVar384),
                      CONCAT12((uVar381 != 0) * (uVar381 < 0x100) * (char)(uVar380 >> 8) -
                               (0xff < uVar381),uVar342));
    uVar79 = CONCAT15((uVar389 != 0) * (uVar389 < 0x100) * (char)(uVar388 >> 8) - (0xff < uVar389),
                      CONCAT14((uVar387 != 0) * (uVar387 < 0x100) * (char)(uVar386 >> 8) -
                               (0xff < uVar387),uVar78));
    uVar80 = CONCAT17((uVar393 != 0) * (uVar393 < 0x100) * (char)(uVar392 >> 8) - (0xff < uVar393),
                      CONCAT16((uVar391 != 0) * (uVar391 < 0x100) * (char)(uVar390 >> 8) -
                               (0xff < uVar391),uVar79));
    auVar345._0_10_ =
         CONCAT19((uVar300 != 0) * (uVar300 < 0x100) * (char)((ushort)((ushort)bVar94 * 0x4f) >> 8)
                  - (0xff < uVar300),
                  CONCAT18((uVar276 != 0) * (uVar276 < 0x100) *
                           (char)((ushort)((ushort)bVar93 * 0x4f) >> 8) - (0xff < uVar276),uVar80));
    auVar345[10] = (uVar301 != 0) * (uVar301 < 0x100) * (char)((ushort)((ushort)bVar95 * 0x4f) >> 8)
                   - (0xff < uVar301);
    auVar345[0xb] =
         (uVar302 != 0) * (uVar302 < 0x100) * (char)((ushort)((ushort)bVar96 * 0x4f) >> 8) -
         (0xff < uVar302);
    auVar347[0xc] =
         (uVar303 != 0) * (uVar303 < 0x100) * (char)((ushort)((ushort)bVar97 * 0x4f) >> 8) -
         (0xff < uVar303);
    auVar347._0_12_ = auVar345;
    auVar347[0xd] =
         (uVar304 != 0) * (uVar304 < 0x100) * (char)((ushort)((ushort)bVar98 * 0x4f) >> 8) -
         (0xff < uVar304);
    auVar362[0xe] =
         (uVar305 != 0) * (uVar305 < 0x100) * (char)((ushort)((ushort)bVar99 * 0x4f) >> 8) -
         (0xff < uVar305);
    auVar362._0_14_ = auVar347;
    auVar362[0xf] =
         (uVar306 != 0) * (uVar306 < 0x100) * (char)((ushort)((ushort)bVar100 * 0x4f) >> 8) -
         (0xff < uVar306);
    auVar363._0_2_ = uVar342 >> 3;
    auVar363._2_2_ = (ushort)((uint)uVar78 >> 0x13);
    auVar363._4_2_ = (ushort)((uint6)uVar79 >> 0x23);
    auVar363._6_2_ = (ushort)((ulong)uVar80 >> 0x33);
    auVar363._8_2_ = (ushort)((unkuint10)auVar345._0_10_ >> 0x43);
    auVar363._10_2_ = auVar345._10_2_ >> 3;
    auVar363._12_2_ = auVar347._12_2_ >> 3;
    auVar363._14_2_ = auVar362._14_2_ >> 3;
    auVar363 = auVar363 & _DAT_0013f2d0;
    sVar133 = CONCAT11(auVar363[8],auVar363[8]);
    uVar78 = CONCAT13(auVar363[9],CONCAT12(auVar363[9],sVar133));
    uVar79 = CONCAT15(auVar363[10],CONCAT14(auVar363[10],uVar78));
    uVar80 = CONCAT17(auVar363[0xb],CONCAT16(auVar363[0xb],uVar79));
    auVar278._0_10_ = CONCAT19(auVar363[0xc],CONCAT18(auVar363[0xc],uVar80));
    auVar278[10] = auVar363[0xd];
    auVar278[0xb] = auVar363[0xd];
    auVar280[0xc] = auVar363[0xe];
    auVar280._0_12_ = auVar278;
    auVar280[0xd] = auVar363[0xe];
    auVar283[0xf] = auVar363[0xf];
    auVar283[0xe] = auVar283[0xf];
    auVar283._0_14_ = auVar280;
    uVar276 = sVar133 * 0x1a;
    uVar301 = (short)((uint)uVar78 >> 0x10) * 0x1a;
    uVar303 = (short)((uint6)uVar79 >> 0x20) * 0x1a;
    uVar305 = (short)((ulong)uVar80 >> 0x30) * 0x1a;
    uVar342 = (short)((unkuint10)auVar278._0_10_ >> 0x40) * 0x1a;
    uVar377 = auVar278._10_2_ * 0x1a;
    uVar380 = auVar280._12_2_ * 0x1a;
    uVar383 = auVar283._14_2_ * 0x1a;
    uVar300 = uVar276 & 0xff;
    uVar302 = uVar301 & 0xff;
    uVar304 = uVar303 & 0xff;
    uVar306 = uVar305 & 0xff;
    uVar343 = uVar342 & 0xff;
    uVar378 = uVar377 & 0xff;
    uVar381 = uVar380 & 0xff;
    uVar384 = uVar383 & 0xff;
    auVar368._0_14_ = auVar363._0_14_;
    auVar368[0xe] = auVar363[7];
    auVar368[0xf] = auVar363[7];
    auVar367._14_2_ = auVar368._14_2_;
    auVar367._0_13_ = auVar363._0_13_;
    auVar367[0xd] = auVar363[6];
    auVar366._13_3_ = auVar367._13_3_;
    auVar366._0_12_ = auVar363._0_12_;
    auVar366[0xc] = auVar363[6];
    auVar365._12_4_ = auVar366._12_4_;
    auVar365._0_11_ = auVar363._0_11_;
    auVar365[0xb] = auVar363[5];
    auVar364._11_5_ = auVar365._11_5_;
    auVar364._0_10_ = auVar363._0_10_;
    auVar364[10] = auVar363[5];
    bVar341 = auVar363[0] * '\x1a';
    bVar376 = auVar363[1] * '\x1a';
    bVar379 = auVar363[2] * '\x1a';
    bVar382 = auVar363[3] * '\x1a';
    bVar385 = auVar363[4] * '\x1a';
    uVar391 = auVar364._10_2_ * 0x1a;
    uVar393 = auVar366._12_2_ * 0x1a;
    uVar386 = (ushort)bVar341;
    uVar387 = (ushort)bVar376;
    uVar388 = (ushort)bVar379;
    uVar389 = (ushort)bVar382;
    uVar390 = (ushort)bVar385;
    uVar392 = uVar391 & 0xff;
    uVar125 = uVar393 & 0xff;
    uVar126 = auVar367._14_2_ * 0x1a & 0xff;
    if ((auVar281 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40] = (auVar187[0] - ((uVar386 != 0) * (uVar386 < 0x100) * bVar341 - (0xff < uVar386))
                    ) + 'a';
    }
    auVar281 = packssdw(auVar316,auVar316);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._0_4_ >> 8 & 1) != 0) {
      str[lVar40 + 1] =
           (cVar118 - ((uVar387 != 0) * (uVar387 < 0x100) * bVar376 - (0xff < uVar387))) + 'a';
    }
    auVar281 = auVar156 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar334._4_4_ = iVar37;
    auVar334._0_4_ = iVar37;
    auVar334._8_4_ = iVar77;
    auVar334._12_4_ = iVar77;
    auVar369._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar369._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar369._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar369._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar317._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar317._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar317._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar317._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar317 = auVar317 & auVar369;
    auVar281 = packssdw(auVar334,auVar317);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    auVar323._8_8_ = lStack_60;
    auVar323._0_8_ = lVar68;
    if ((auVar281._0_4_ >> 0x10 & 1) != 0) {
      str[lVar40 + 2] =
           (cVar119 - ((uVar388 != 0) * (uVar388 < 0x100) * bVar379 - (0xff < uVar388))) + 'a';
    }
    auVar281 = pshufhw(auVar317,auVar317,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._0_4_ >> 0x18 & 1) != 0) {
      str[lVar40 + 3] =
           (cVar120 - ((uVar389 != 0) * (uVar389 < 0x100) * bVar382 - (0xff < uVar389))) + 'a';
    }
    auVar281 = auVar135 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar335._4_4_ = iVar37;
    auVar335._0_4_ = iVar37;
    auVar335._8_4_ = iVar77;
    auVar335._12_4_ = iVar77;
    auVar370._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar370._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar370._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar370._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar318._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar318._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar318._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar318._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar318 = auVar318 & auVar370;
    auVar281 = pshuflw(auVar335,auVar318,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 4] =
           (cVar121 - ((uVar390 != 0) * (uVar390 < 0x100) * bVar385 - (0xff < uVar390))) + 'a';
    }
    auVar281 = packssdw(auVar318,auVar318);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._4_2_ >> 8 & 1) != 0) {
      str[lVar40 + 5] =
           (cVar122 - ((uVar392 != 0) * (uVar392 < 0x100) * (char)uVar391 - (0xff < uVar392))) + 'a'
      ;
    }
    auVar281 = auVar128 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar336._4_4_ = iVar37;
    auVar336._0_4_ = iVar37;
    auVar336._8_4_ = iVar77;
    auVar336._12_4_ = iVar77;
    auVar371._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar371._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar371._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar371._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar319._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar319._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar319._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar319._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar319 = auVar319 & auVar371;
    auVar281 = packssdw(auVar336,auVar319);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 6] =
           (cVar123 - ((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar393 - (0xff < uVar125))) + 'a'
      ;
    }
    auVar281 = pshufhw(auVar319,auVar319,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._6_2_ >> 8 & 1) != 0) {
      str[lVar40 + 7] =
           (cVar124 -
           ((uVar126 != 0) * (uVar126 < 0x100) * (char)(auVar367._14_2_ * 0x1a) - (0xff < uVar126)))
           + 'a';
    }
    auVar281 = auVar105 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar337._4_4_ = iVar37;
    auVar337._0_4_ = iVar37;
    auVar337._8_4_ = iVar77;
    auVar337._12_4_ = iVar77;
    auVar372._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar372._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar372._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar372._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar320._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar320._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar320._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar320._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar320 = auVar320 & auVar372;
    auVar281 = pshuflw(auVar337,auVar320,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar40 + 8] =
           (bVar93 - ((uVar300 != 0) * (uVar300 < 0x100) * (char)uVar276 - (0xff < uVar300))) + 'a';
    }
    auVar281 = packssdw(auVar320,auVar320);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._8_2_ >> 8 & 1) != 0) {
      str[lVar40 + 9] =
           (bVar94 - ((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar301 - (0xff < uVar302))) + 'a';
    }
    auVar281 = auVar86 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar338._4_4_ = iVar37;
    auVar338._0_4_ = iVar37;
    auVar338._8_4_ = iVar77;
    auVar338._12_4_ = iVar77;
    auVar373._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar373._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar373._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar373._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar321._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar321._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar321._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar321._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar321 = auVar321 & auVar373;
    auVar281 = packssdw(auVar338,auVar321);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar40 + 10] =
           (bVar95 - ((uVar304 != 0) * (uVar304 < 0x100) * (char)uVar303 - (0xff < uVar304))) + 'a';
    }
    auVar281 = pshufhw(auVar321,auVar321,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._10_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xb] =
           (bVar96 - ((uVar306 != 0) * (uVar306 < 0x100) * (char)uVar305 - (0xff < uVar306))) + 'a';
    }
    auVar281 = auVar70 ^ _DAT_0013f1c0;
    iVar37 = auVar281._0_4_;
    iVar77 = auVar281._8_4_;
    auVar339._4_4_ = iVar37;
    auVar339._0_4_ = iVar37;
    auVar339._8_4_ = iVar77;
    auVar339._12_4_ = iVar77;
    auVar374._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar374._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar374._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar374._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar322._0_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar322._4_4_ = -(uint)(auVar281._4_4_ == -0x80000000);
    auVar322._8_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar322._12_4_ = -(uint)(auVar281._12_4_ == -0x80000000);
    auVar322 = auVar322 & auVar374;
    auVar281 = pshuflw(auVar339,auVar322,0xe8);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xc] =
           (bVar97 - ((uVar343 != 0) * (uVar343 < 0x100) * (char)uVar342 - (0xff < uVar343))) + 'a';
    }
    auVar281 = packssdw(auVar322,auVar322);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._12_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xd] =
           (bVar98 - ((uVar378 != 0) * (uVar378 < 0x100) * (char)uVar377 - (0xff < uVar378))) + 'a';
    }
    auVar323 = auVar323 ^ _DAT_0013f1c0;
    iVar37 = auVar323._0_4_;
    iVar77 = auVar323._8_4_;
    auVar340._4_4_ = iVar37;
    auVar340._0_4_ = iVar37;
    auVar340._8_4_ = iVar77;
    auVar340._12_4_ = iVar77;
    auVar375._0_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar375._4_4_ = -(uint)(iVar37 < -0x7fffff01);
    auVar375._8_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar375._12_4_ = -(uint)(iVar77 < -0x7fffff01);
    auVar324._0_4_ = -(uint)(auVar323._4_4_ == -0x80000000);
    auVar324._4_4_ = -(uint)(auVar323._4_4_ == -0x80000000);
    auVar324._8_4_ = -(uint)(auVar323._12_4_ == -0x80000000);
    auVar324._12_4_ = -(uint)(auVar323._12_4_ == -0x80000000);
    auVar324 = auVar324 & auVar375;
    auVar281 = packssdw(auVar340,auVar324);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar40 + 0xe] =
           (bVar99 - ((uVar381 != 0) * (uVar381 < 0x100) * (char)uVar380 - (0xff < uVar381))) + 'a';
    }
    auVar281 = pshufhw(auVar324,auVar324,0x84);
    auVar281 = packssdw(auVar281,auVar281);
    auVar281 = packsswb(auVar281,auVar281);
    if ((auVar281._14_2_ >> 8 & 1) != 0) {
      str[lVar40 + 0xf] =
           (bVar100 - ((uVar384 != 0) * (uVar384 < 0x100) * (char)uVar383 - (0xff < uVar384))) + 'a'
      ;
    }
    lVar40 = lVar40 + 0x10;
    lVar39 = auVar176._8_8_;
    auVar176._0_8_ = auVar176._0_8_ + 0x10;
    auVar176._8_8_ = lVar39 + 0x10;
    lVar39 = auVar156._8_8_;
    auVar156._0_8_ = auVar156._0_8_ + 0x10;
    auVar156._8_8_ = lVar39 + 0x10;
    lVar39 = auVar135._8_8_;
    auVar135._0_8_ = auVar135._0_8_ + 0x10;
    auVar135._8_8_ = lVar39 + 0x10;
    lVar39 = auVar128._8_8_;
    auVar128._0_8_ = auVar128._0_8_ + 0x10;
    auVar128._8_8_ = lVar39 + 0x10;
    lVar39 = auVar105._8_8_;
    auVar105._0_8_ = auVar105._0_8_ + 0x10;
    auVar105._8_8_ = lVar39 + 0x10;
    lVar39 = auVar86._8_8_;
    auVar86._0_8_ = auVar86._0_8_ + 0x10;
    auVar86._8_8_ = lVar39 + 0x10;
    lVar39 = auVar70._8_8_;
    auVar70._0_8_ = auVar70._0_8_ + 0x10;
    auVar70._8_8_ = lVar39 + 0x10;
    lVar68 = lVar68 + 0x10;
    auVar187[0] = auVar187[0] + '\x10';
    auVar187[1] = cVar118 + '\x10';
    auVar187[2] = cVar119 + '\x10';
    auVar187[3] = cVar120 + '\x10';
    auVar187[4] = cVar121 + '\x10';
    auVar187[5] = cVar122 + '\x10';
    auVar187[6] = cVar123 + '\x10';
    auVar187[7] = cVar124 + '\x10';
    auVar187[8] = bVar93 + 0x10;
    auVar187[9] = bVar94 + 0x10;
    auVar187[10] = bVar95 + 0x10;
    auVar187[0xb] = bVar96 + 0x10;
    auVar187[0xc] = bVar97 + 0x10;
    auVar187[0xd] = bVar98 + 0x10;
    auVar187[0xe] = bVar99 + 0x10;
    auVar187[0xf] = bVar100 + 0x10;
    lVar39 = lStack_60 + 0x10;
  } while (lVar40 != 0x100);
  buf[1] = -0x3c;
  buf[2] = -1;
  pcVar51 = buf + 3;
  memcpy(buf + 3,str,0xff);
  pcVar43 = "0xff == len2";
  _ok(1,"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_decode_bin(x, %u))",0xff);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_00123751:
      uVar36 = (uint)(byte)buf[2];
    }
    else if (uVar36 == 0xc5) {
LAB_0012376b:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar51 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0012375a;
LAB_00123782:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e89;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0012376b;
      if (uVar36 != 0xd9) goto LAB_00123782;
      goto LAB_00123751;
    }
LAB_0012375a:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  unaff_RBP = pcVar51 + uVar36;
  _ok((uint)(uVar36 == 0xff),"0xff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_decode_strbin(x, %u))",0xff);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xff));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "mp_check_bin(mp_encode_bin(x, 0xff))");
  _ok((uint)(unaff_RBP == buf + 0x102),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_decode_bin(x, 0xff)");
  _ok((uint)(local_80 == (byte *)(buf + 0x102)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_next_bin(x, 0xff)");
  _ok((uint)(local_70 == buf + 0x102),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "len(mp_check_bin(x, 0xff)");
  _ok(1,"mp_sizeof_bin(0xff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "mp_sizeof_bin(0xff)");
  pcVar51 = buf + 3;
  iVar37 = bcmp(str,buf + 3,0xff);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23e,
      "mp_encode_bin(x, 0xff) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0x100",0xd,1,_stdout);
  fputc(10,_stdout);
  auVar177 = _DAT_0013f320;
  auVar281 = _DAT_0013f2d0;
  auVar61 = _DAT_0013f2a0;
  do {
    bVar93 = auVar61[8];
    bVar94 = auVar61[9];
    bVar95 = auVar61[10];
    bVar96 = auVar61[0xb];
    bVar97 = auVar61[0xc];
    bVar98 = auVar61[0xd];
    bVar99 = auVar61[0xe];
    bVar100 = auVar61[0xf];
    uVar276 = (ushort)((ushort)bVar93 * 0x4f) >> 8;
    uVar300 = (ushort)((ushort)bVar94 * 0x4f) >> 8;
    uVar301 = (ushort)((ushort)bVar95 * 0x4f) >> 8;
    uVar302 = (ushort)((ushort)bVar96 * 0x4f) >> 8;
    uVar303 = (ushort)((ushort)bVar97 * 0x4f) >> 8;
    uVar304 = (ushort)((ushort)bVar98 * 0x4f) >> 8;
    uVar305 = (ushort)((ushort)bVar99 * 0x4f) >> 8;
    uVar306 = (ushort)((ushort)bVar100 * 0x4f) >> 8;
    cVar124 = auVar61[7];
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar61._0_13_;
    auVar3[0xe] = cVar124;
    cVar123 = auVar61[6];
    auVar6[0xc] = cVar123;
    auVar6._0_12_ = auVar61._0_12_;
    auVar6._13_2_ = auVar3._13_2_;
    auVar9[0xb] = 0;
    auVar9._0_11_ = auVar61._0_11_;
    auVar9._12_3_ = auVar6._12_3_;
    cVar122 = auVar61[5];
    auVar12[10] = cVar122;
    auVar12._0_10_ = auVar61._0_10_;
    auVar12._11_4_ = auVar9._11_4_;
    auVar15[9] = 0;
    auVar15._0_9_ = auVar61._0_9_;
    auVar15._10_5_ = auVar12._10_5_;
    cVar121 = auVar61[4];
    auVar18[8] = cVar121;
    auVar18._0_8_ = auVar61._0_8_;
    auVar18._9_6_ = auVar15._9_6_;
    auVar28._7_8_ = 0;
    auVar28._0_7_ = auVar18._8_7_;
    cVar120 = auVar61[3];
    Var24 = CONCAT81(SUB158(auVar28 << 0x40,7),cVar120);
    auVar34._9_6_ = 0;
    auVar34._0_9_ = Var24;
    cVar119 = auVar61[2];
    auVar29._1_10_ = SUB1510(auVar34 << 0x30,5);
    auVar29[0] = cVar119;
    auVar35._11_4_ = 0;
    auVar35._0_11_ = auVar29;
    cVar118 = auVar61[1];
    auVar21[2] = cVar118;
    auVar21._0_2_ = auVar61._0_2_;
    auVar21._3_12_ = SUB1512(auVar35 << 0x20,3);
    uVar342 = (auVar61._0_2_ & 0xff) * 0x4f;
    uVar377 = auVar21._2_2_ * 0x4f;
    uVar380 = auVar29._0_2_ * 0x4f;
    uVar383 = (short)Var24 * 0x4f;
    uVar386 = auVar18._8_2_ * 0x4f;
    uVar388 = auVar12._10_2_ * 0x4f;
    uVar390 = auVar6._12_2_ * 0x4f;
    uVar392 = (auVar3._13_2_ >> 8) * 0x4f;
    uVar343 = uVar342 >> 8;
    uVar378 = uVar377 >> 8;
    uVar381 = uVar380 >> 8;
    uVar384 = uVar383 >> 8;
    uVar387 = uVar386 >> 8;
    uVar389 = uVar388 >> 8;
    uVar391 = uVar390 >> 8;
    uVar393 = uVar392 >> 8;
    uVar342 = CONCAT11((uVar378 != 0) * (uVar378 < 0x100) * (char)(uVar377 >> 8) - (0xff < uVar378),
                       (uVar343 != 0) * (uVar343 < 0x100) * (char)(uVar342 >> 8) - (0xff < uVar343))
    ;
    uVar78 = CONCAT13((uVar384 != 0) * (uVar384 < 0x100) * (char)(uVar383 >> 8) - (0xff < uVar384),
                      CONCAT12((uVar381 != 0) * (uVar381 < 0x100) * (char)(uVar380 >> 8) -
                               (0xff < uVar381),uVar342));
    uVar79 = CONCAT15((uVar389 != 0) * (uVar389 < 0x100) * (char)(uVar388 >> 8) - (0xff < uVar389),
                      CONCAT14((uVar387 != 0) * (uVar387 < 0x100) * (char)(uVar386 >> 8) -
                               (0xff < uVar387),uVar78));
    uVar80 = CONCAT17((uVar393 != 0) * (uVar393 < 0x100) * (char)(uVar392 >> 8) - (0xff < uVar393),
                      CONCAT16((uVar391 != 0) * (uVar391 < 0x100) * (char)(uVar390 >> 8) -
                               (0xff < uVar391),uVar79));
    auVar102._0_10_ =
         CONCAT19((uVar300 != 0) * (uVar300 < 0x100) * (char)((ushort)((ushort)bVar94 * 0x4f) >> 8)
                  - (0xff < uVar300),
                  CONCAT18((uVar276 != 0) * (uVar276 < 0x100) *
                           (char)((ushort)((ushort)bVar93 * 0x4f) >> 8) - (0xff < uVar276),uVar80));
    auVar102[10] = (uVar301 != 0) * (uVar301 < 0x100) * (char)((ushort)((ushort)bVar95 * 0x4f) >> 8)
                   - (0xff < uVar301);
    auVar102[0xb] =
         (uVar302 != 0) * (uVar302 < 0x100) * (char)((ushort)((ushort)bVar96 * 0x4f) >> 8) -
         (0xff < uVar302);
    auVar103[0xc] =
         (uVar303 != 0) * (uVar303 < 0x100) * (char)((ushort)((ushort)bVar97 * 0x4f) >> 8) -
         (0xff < uVar303);
    auVar103._0_12_ = auVar102;
    auVar103[0xd] =
         (uVar304 != 0) * (uVar304 < 0x100) * (char)((ushort)((ushort)bVar98 * 0x4f) >> 8) -
         (0xff < uVar304);
    auVar106[0xe] =
         (uVar305 != 0) * (uVar305 < 0x100) * (char)((ushort)((ushort)bVar99 * 0x4f) >> 8) -
         (0xff < uVar305);
    auVar106._0_14_ = auVar103;
    auVar106[0xf] =
         (uVar306 != 0) * (uVar306 < 0x100) * (char)((ushort)((ushort)bVar100 * 0x4f) >> 8) -
         (0xff < uVar306);
    auVar107._0_2_ = uVar342 >> 3;
    auVar107._2_2_ = (ushort)((uint)uVar78 >> 0x13);
    auVar107._4_2_ = (ushort)((uint6)uVar79 >> 0x23);
    auVar107._6_2_ = (ushort)((ulong)uVar80 >> 0x33);
    auVar107._8_2_ = (ushort)((unkuint10)auVar102._0_10_ >> 0x43);
    auVar107._10_2_ = auVar102._10_2_ >> 3;
    auVar107._12_2_ = auVar103._12_2_ >> 3;
    auVar107._14_2_ = auVar106._14_2_ >> 3;
    auVar107 = auVar107 & auVar281;
    sVar133 = CONCAT11(auVar107[8],auVar107[8]);
    uVar78 = CONCAT13(auVar107[9],CONCAT12(auVar107[9],sVar133));
    uVar79 = CONCAT15(auVar107[10],CONCAT14(auVar107[10],uVar78));
    uVar80 = CONCAT17(auVar107[0xb],CONCAT16(auVar107[0xb],uVar79));
    auVar81._0_10_ = CONCAT19(auVar107[0xc],CONCAT18(auVar107[0xc],uVar80));
    auVar81[10] = auVar107[0xd];
    auVar81[0xb] = auVar107[0xd];
    auVar82[0xc] = auVar107[0xe];
    auVar82._0_12_ = auVar81;
    auVar82[0xd] = auVar107[0xe];
    auVar87[0xf] = auVar107[0xf];
    auVar87[0xe] = auVar87[0xf];
    auVar87._0_14_ = auVar82;
    uVar276 = sVar133 * 0x1a;
    uVar301 = (short)((uint)uVar78 >> 0x10) * 0x1a;
    uVar303 = (short)((uint6)uVar79 >> 0x20) * 0x1a;
    uVar305 = (short)((ulong)uVar80 >> 0x30) * 0x1a;
    uVar342 = (short)((unkuint10)auVar81._0_10_ >> 0x40) * 0x1a;
    uVar377 = auVar81._10_2_ * 0x1a;
    uVar380 = auVar82._12_2_ * 0x1a;
    uVar383 = auVar87._14_2_ * 0x1a;
    uVar300 = uVar276 & 0xff;
    uVar302 = uVar301 & 0xff;
    uVar304 = uVar303 & 0xff;
    uVar306 = uVar305 & 0xff;
    uVar343 = uVar342 & 0xff;
    uVar378 = uVar377 & 0xff;
    uVar381 = uVar380 & 0xff;
    uVar384 = uVar383 & 0xff;
    auVar112._0_14_ = auVar107._0_14_;
    auVar112[0xe] = auVar107[7];
    auVar112[0xf] = auVar107[7];
    auVar111._14_2_ = auVar112._14_2_;
    auVar111._0_13_ = auVar107._0_13_;
    auVar111[0xd] = auVar107[6];
    auVar110._13_3_ = auVar111._13_3_;
    auVar110._0_12_ = auVar107._0_12_;
    auVar110[0xc] = auVar107[6];
    auVar109._12_4_ = auVar110._12_4_;
    auVar109._0_11_ = auVar107._0_11_;
    auVar109[0xb] = auVar107[5];
    auVar108._11_5_ = auVar109._11_5_;
    auVar108._0_10_ = auVar107._0_10_;
    auVar108[10] = auVar107[5];
    bVar341 = auVar107[0] * '\x1a';
    bVar376 = auVar107[1] * '\x1a';
    bVar379 = auVar107[2] * '\x1a';
    bVar382 = auVar107[3] * '\x1a';
    bVar385 = auVar107[4] * '\x1a';
    uVar391 = auVar108._10_2_ * 0x1a;
    uVar393 = auVar110._12_2_ * 0x1a;
    uVar386 = (ushort)bVar341;
    uVar387 = (ushort)bVar376;
    uVar388 = (ushort)bVar379;
    uVar389 = (ushort)bVar382;
    uVar390 = (ushort)bVar385;
    uVar392 = uVar391 & 0xff;
    uVar125 = uVar393 & 0xff;
    uVar126 = auVar111._14_2_ * 0x1a & 0xff;
    str[lVar39] = (auVar61[0] - ((uVar386 != 0) * (uVar386 < 0x100) * bVar341 - (0xff < uVar386))) +
                  'a';
    str[lVar39 + 1] =
         (cVar118 - ((uVar387 != 0) * (uVar387 < 0x100) * bVar376 - (0xff < uVar387))) + 'a';
    str[lVar39 + 2] =
         (cVar119 - ((uVar388 != 0) * (uVar388 < 0x100) * bVar379 - (0xff < uVar388))) + 'a';
    str[lVar39 + 3] =
         (cVar120 - ((uVar389 != 0) * (uVar389 < 0x100) * bVar382 - (0xff < uVar389))) + 'a';
    str[lVar39 + 4] =
         (cVar121 - ((uVar390 != 0) * (uVar390 < 0x100) * bVar385 - (0xff < uVar390))) + 'a';
    str[lVar39 + 5] =
         (cVar122 - ((uVar392 != 0) * (uVar392 < 0x100) * (char)uVar391 - (0xff < uVar392))) + 'a';
    str[lVar39 + 6] =
         (cVar123 - ((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar393 - (0xff < uVar125))) + 'a';
    str[lVar39 + 7] =
         (cVar124 -
         ((uVar126 != 0) * (uVar126 < 0x100) * (char)(auVar111._14_2_ * 0x1a) - (0xff < uVar126))) +
         'a';
    str[lVar39 + 8] =
         (bVar93 - ((uVar300 != 0) * (uVar300 < 0x100) * (char)uVar276 - (0xff < uVar300))) + 'a';
    str[lVar39 + 9] =
         (bVar94 - ((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar301 - (0xff < uVar302))) + 'a';
    str[lVar39 + 10] =
         (bVar95 - ((uVar304 != 0) * (uVar304 < 0x100) * (char)uVar303 - (0xff < uVar304))) + 'a';
    str[lVar39 + 0xb] =
         (bVar96 - ((uVar306 != 0) * (uVar306 < 0x100) * (char)uVar305 - (0xff < uVar306))) + 'a';
    str[lVar39 + 0xc] =
         (bVar97 - ((uVar343 != 0) * (uVar343 < 0x100) * (char)uVar342 - (0xff < uVar343))) + 'a';
    str[lVar39 + 0xd] =
         (bVar98 - ((uVar378 != 0) * (uVar378 < 0x100) * (char)uVar377 - (0xff < uVar378))) + 'a';
    str[lVar39 + 0xe] =
         (bVar99 - ((uVar381 != 0) * (uVar381 < 0x100) * (char)uVar380 - (0xff < uVar381))) + 'a';
    str[lVar39 + 0xf] =
         (bVar100 - ((uVar384 != 0) * (uVar384 < 0x100) * (char)uVar383 - (0xff < uVar384))) + 'a';
    lVar39 = lVar39 + 0x10;
    auVar61[0] = auVar61[0] + auVar177[0];
    auVar61[1] = cVar118 + auVar177[1];
    auVar61[2] = cVar119 + auVar177[2];
    auVar61[3] = cVar120 + auVar177[3];
    auVar61[4] = cVar121 + auVar177[4];
    auVar61[5] = cVar122 + auVar177[5];
    auVar61[6] = cVar123 + auVar177[6];
    auVar61[7] = cVar124 + auVar177[7];
    auVar61[8] = bVar93 + auVar177[8];
    auVar61[9] = bVar94 + auVar177[9];
    auVar61[10] = bVar95 + auVar177[10];
    auVar61[0xb] = bVar96 + auVar177[0xb];
    auVar61[0xc] = bVar97 + auVar177[0xc];
    auVar61[0xd] = bVar98 + auVar177[0xd];
    auVar61[0xe] = bVar99 + auVar177[0xe];
    auVar61[0xf] = bVar100 + auVar177[0xf];
  } while (lVar39 != 0x100);
  buf[1] = -0x3b;
  buf[2] = '\x01';
  buf[3] = '\0';
  memcpy(buf + 4,str,0x100);
  pcVar43 = "0x100 == len2";
  _ok(1,"0x100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_decode_bin(x, %u))",0x100);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_00123af3:
      uVar36 = (uint)(byte)buf[2];
    }
    else if (uVar36 == 0xc5) {
LAB_00123b0d:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar51 = buf + 4;
    }
    else {
      if (uVar36 == 0xc6) goto LAB_00123afc;
LAB_00123b20:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e8e;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_00123b0d;
      if (uVar36 != 0xd9) goto LAB_00123b20;
      goto LAB_00123af3;
    }
LAB_00123afc:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x100),"0x100 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_decode_strbin(x, %u))",0x100);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x100));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x100)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "mp_check_bin(mp_encode_bin(x, 0x100))");
  unaff_RBP = buf + 0x104;
  _ok((uint)(pcVar51 + uVar36 == buf + 0x104),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_decode_bin(x, 0x100)");
  _ok((uint)(local_80 == (byte *)(buf + 0x104)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_next_bin(x, 0x100)");
  _ok((uint)(local_70 == buf + 0x104),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "len(mp_check_bin(x, 0x100)");
  _ok(1,"mp_sizeof_bin(0x100) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "mp_sizeof_bin(0x100)");
  iVar37 = bcmp(str,buf + 4,0x100);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x100) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x23f,
      "mp_encode_bin(x, 0x100) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0x101",0xd,1,_stdout);
  fputc(10,_stdout);
  auVar281 = _DAT_0013f1c0;
  uVar276 = 7;
  uVar300 = 6;
  uVar301 = 5;
  uVar302 = 4;
  uVar303 = 3;
  uVar304 = 2;
  uVar305 = 1;
  auVar62 = _DAT_0013f270;
  auVar71 = _DAT_0013f280;
  auVar88 = _DAT_0013f290;
  auVar113 = _DAT_0013f1b0;
  do {
    auVar177 = auVar113 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar188._4_4_ = iVar37;
    auVar188._0_4_ = iVar37;
    auVar188._8_4_ = iVar77;
    auVar188._12_4_ = iVar77;
    auVar208._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar208._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar208._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar208._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar178._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar178._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar178._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar178._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar178 = auVar178 & auVar208;
    auVar177 = pshuflw(auVar188,auVar178,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    cVar118 = (char)lVar39;
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39] = ((char)(((uint)lVar39 & 0xffff) / 0x1a) * -0x1a + 0x60U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar178,auVar178);
    auVar177 = packssdw(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x10 & 1) != 0) {
      str[lVar39 + 1] = (char)(uVar305 / 0x1a) * -0x1a + 'b' + cVar118;
    }
    auVar177 = auVar88 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar189._4_4_ = iVar37;
    auVar189._0_4_ = iVar37;
    auVar189._8_4_ = iVar77;
    auVar189._12_4_ = iVar77;
    auVar209._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar209._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar209._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar209._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar179._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar179._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar179._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar179._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar179 = auVar179 & auVar209;
    auVar177 = packssdw(auVar189,auVar179);
    auVar177 = packssdw(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 2] = ((char)(uVar304 / 0x1a) * -0x1a + 0x62U | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar179,auVar179,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 3] = (char)(uVar303 / 0x1a) * -0x1a + 'd' + cVar118;
    }
    auVar177 = auVar71 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar190._4_4_ = iVar37;
    auVar190._0_4_ = iVar37;
    auVar190._8_4_ = iVar77;
    auVar190._12_4_ = iVar77;
    auVar210._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar210._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar210._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar210._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar180._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar180._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar180._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar180._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar180 = auVar180 & auVar210;
    auVar177 = pshuflw(auVar190,auVar180,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39 + 4] = ((char)(uVar302 / 0x1a) * -0x1a + 100U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar180,auVar180);
    auVar177 = packssdw(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar39 + 5] = (char)(uVar301 / 0x1a) * -0x1a + 'f' + cVar118;
    }
    auVar177 = auVar62 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar191._4_4_ = iVar37;
    auVar191._0_4_ = iVar37;
    auVar191._8_4_ = iVar77;
    auVar191._12_4_ = iVar77;
    auVar211._0_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar211._4_4_ = -(uint)(iVar37 < -0x7ffffeff);
    auVar211._8_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar211._12_4_ = -(uint)(iVar77 < -0x7ffffeff);
    auVar181._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar181._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar181._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar181._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar181 = auVar181 & auVar211;
    auVar177 = packssdw(auVar191,auVar181);
    auVar177 = packssdw(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 6] = ((char)(uVar300 / 0x1a) * -0x1a + 0x66U | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar181,auVar181,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 7] = (char)(uVar276 / 0x1a) * -0x1a + 'h' + cVar118;
    }
    lVar39 = lVar39 + 8;
    lVar40 = auVar113._8_8_;
    auVar113._0_8_ = auVar113._0_8_ + 8;
    auVar113._8_8_ = lVar40 + 8;
    lVar40 = auVar88._8_8_;
    auVar88._0_8_ = auVar88._0_8_ + 8;
    auVar88._8_8_ = lVar40 + 8;
    lVar40 = auVar71._8_8_;
    auVar71._0_8_ = auVar71._0_8_ + 8;
    auVar71._8_8_ = lVar40 + 8;
    lVar40 = auVar62._8_8_;
    auVar62._0_8_ = auVar62._0_8_ + 8;
    auVar62._8_8_ = lVar40 + 8;
    uVar276 = uVar276 + 8;
    uVar300 = uVar300 + 8;
    uVar301 = uVar301 + 8;
    uVar302 = uVar302 + 8;
    uVar303 = uVar303 + 8;
    uVar304 = uVar304 + 8;
    uVar305 = uVar305 + 8;
  } while (lVar39 != 0x108);
  buf[1] = -0x3b;
  buf[2] = '\x01';
  buf[3] = '\x01';
  pcVar51 = buf + 4;
  memcpy(buf + 4,str,0x101);
  pcVar43 = "0x101 == len2";
  _ok(1,"0x101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_decode_bin(x, %u))",0x101);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0012412d:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0012414e:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0012413d;
LAB_0012415e:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e93;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0012414e;
      if (uVar36 != 0xd9) goto LAB_0012415e;
      goto LAB_0012412d;
    }
LAB_0012413d:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x101),"0x101 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_decode_strbin(x, %u))",0x101);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x101));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x101)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "mp_check_bin(mp_encode_bin(x, 0x101))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x105),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_decode_bin(x, 0x101)");
  _ok((uint)(local_80 == (byte *)(buf + 0x105)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_next_bin(x, 0x101)");
  _ok((uint)(local_70 == buf + 0x105),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "len(mp_check_bin(x, 0x101)");
  _ok(1,"mp_sizeof_bin(0x101) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "mp_sizeof_bin(0x101)");
  iVar37 = bcmp(str,buf + 4,0x101);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x101) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x240,
      "mp_encode_bin(x, 0x101) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0xfffe",0xe,1,_stdout);
  iVar37 = fputc(10,_stdout);
  auVar281 = _DAT_0013f1c0;
  uVar276 = (ushort)((uint)iVar37 >> 0x10);
  local_68 = CONCAT22(uVar276,0xf);
  local_74 = CONCAT22(uVar276,0xe);
  local_78 = (uint)CONCAT62((uint6)uVar276,0xd);
  uVar301 = 0xc;
  uVar302 = 0xb;
  uVar303 = 10;
  uVar304 = 9;
  uVar305 = 8;
  uVar306 = 7;
  uVar377 = 6;
  uVar342 = 5;
  uVar36 = 4;
  uVar343 = 3;
  uVar300 = 2;
  uVar276 = 1;
  auVar63 = _DAT_0013f230;
  auVar72 = _DAT_0013f240;
  auVar89 = _DAT_0013f250;
  auVar114 = _DAT_0013f260;
  auVar129 = _DAT_0013f270;
  auVar136 = _DAT_0013f280;
  auVar157 = _DAT_0013f290;
  auVar182 = _DAT_0013f1b0;
  do {
    auVar177 = auVar182 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar260._4_4_ = iVar37;
    auVar260._0_4_ = iVar37;
    auVar260._8_4_ = iVar77;
    auVar260._12_4_ = iVar77;
    auVar284._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar284._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar284._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar284._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar228._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar228._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar228._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar228._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar228 = auVar228 & auVar284;
    auVar177 = pshuflw(auVar260,auVar228,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    cVar118 = (char)lVar39;
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39] = ((char)(((uint)lVar39 & 0xffff) / 0x1a) * -0x1a + 0x60U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar228,auVar228);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 8 & 1) != 0) {
      str[lVar39 + 1] = (char)(uVar276 / 0x1a) * -0x1a + 'b' + cVar118;
    }
    auVar177 = auVar157 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar261._4_4_ = iVar37;
    auVar261._0_4_ = iVar37;
    auVar261._8_4_ = iVar77;
    auVar261._12_4_ = iVar77;
    auVar285._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar285._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar285._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar285._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar229._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar229._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar229._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar229._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar229 = auVar229 & auVar285;
    auVar177 = packssdw(auVar261,auVar229);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x10 & 1) != 0) {
      str[lVar39 + 2] = ((char)(uVar300 / 0x1a) * -0x1a + 0x62U | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar229,auVar229,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x18 & 1) != 0) {
      str[lVar39 + 3] = (char)(uVar343 / 0x1a) * -0x1a + 'd' + cVar118;
    }
    auVar177 = auVar136 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar262._4_4_ = iVar37;
    auVar262._0_4_ = iVar37;
    auVar262._8_4_ = iVar77;
    auVar262._12_4_ = iVar77;
    auVar286._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar286._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar286._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar286._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar230._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar230._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar230._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar230._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar230 = auVar230 & auVar286;
    auVar177 = pshuflw(auVar262,auVar230,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 4] = ((char)((uVar36 & 0xffff) / 0x1a) * -0x1a + 100U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar230,auVar230);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._4_2_ >> 8 & 1) != 0) {
      str[lVar39 + 5] = (char)(uVar342 / 0x1a) * -0x1a + 'f' + cVar118;
    }
    auVar177 = auVar129 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar263._4_4_ = iVar37;
    auVar263._0_4_ = iVar37;
    auVar263._8_4_ = iVar77;
    auVar263._12_4_ = iVar77;
    auVar287._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar287._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar287._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar287._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar231._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar231._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar231._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar231._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar231 = auVar231 & auVar287;
    auVar177 = packssdw(auVar263,auVar231);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 6] = ((char)(uVar377 / 0x1a) * -0x1a + 0x66U | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar231,auVar231,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._6_2_ >> 8 & 1) != 0) {
      str[lVar39 + 7] = (char)(uVar306 / 0x1a) * -0x1a + 'h' + cVar118;
    }
    auVar177 = auVar114 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar264._4_4_ = iVar37;
    auVar264._0_4_ = iVar37;
    auVar264._8_4_ = iVar77;
    auVar264._12_4_ = iVar77;
    auVar288._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar288._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar288._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar288._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar232._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar232._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar232._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar232._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar232 = auVar232 & auVar288;
    auVar177 = pshuflw(auVar264,auVar232,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39 + 8] = ((char)(uVar305 / 0x1a) * -0x1a + 0x68U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar232,auVar232);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._8_2_ >> 8 & 1) != 0) {
      str[lVar39 + 9] = (char)(uVar304 / 0x1a) * -0x1a + 'j' + cVar118;
    }
    auVar177 = auVar89 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar265._4_4_ = iVar37;
    auVar265._0_4_ = iVar37;
    auVar265._8_4_ = iVar77;
    auVar265._12_4_ = iVar77;
    auVar289._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar289._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar289._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar289._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar233._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar233._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar233._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar233._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar233 = auVar233 & auVar289;
    auVar177 = packssdw(auVar265,auVar233);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar39 + 10] = ((char)(uVar303 / 0x1a) * -0x1a + 0x6aU | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar233,auVar233,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._10_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xb] = (char)(uVar302 / 0x1a) * -0x1a + 'l' + cVar118;
    }
    auVar177 = auVar72 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar266._4_4_ = iVar37;
    auVar266._0_4_ = iVar37;
    auVar266._8_4_ = iVar77;
    auVar266._12_4_ = iVar77;
    auVar290._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar290._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar290._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar290._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar234._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar234._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar234._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar234._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar234 = auVar234 & auVar290;
    auVar177 = pshuflw(auVar266,auVar234,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xc] = ((char)(uVar301 / 0x1a) * -0x1a + 0x6cU | 1) + cVar118;
    }
    auVar177 = packssdw(auVar234,auVar234);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._12_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xd] = (char)((local_78 & 0xffff) / 0x1a) * -0x1a + 'n' + cVar118;
    }
    auVar177 = auVar63 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar267._4_4_ = iVar37;
    auVar267._0_4_ = iVar37;
    auVar267._8_4_ = iVar77;
    auVar267._12_4_ = iVar77;
    auVar291._0_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar291._4_4_ = -(uint)(iVar37 < -0x7fff0002);
    auVar291._8_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar291._12_4_ = -(uint)(iVar77 < -0x7fff0002);
    auVar235._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar235._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar235._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar235._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar235 = auVar235 & auVar291;
    auVar177 = packssdw(auVar267,auVar235);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xe] = ((char)((local_74 & 0xffff) / 0x1a) * -0x1a + 0x6eU | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar235,auVar235,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._14_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xf] = (char)((local_68 & 0xffff) / 0x1a) * -0x1a + 'p' + cVar118;
    }
    lVar39 = lVar39 + 0x10;
    lVar40 = auVar182._8_8_;
    auVar182._0_8_ = auVar182._0_8_ + 0x10;
    auVar182._8_8_ = lVar40 + 0x10;
    lVar40 = auVar157._8_8_;
    auVar157._0_8_ = auVar157._0_8_ + 0x10;
    auVar157._8_8_ = lVar40 + 0x10;
    lVar40 = auVar136._8_8_;
    auVar136._0_8_ = auVar136._0_8_ + 0x10;
    auVar136._8_8_ = lVar40 + 0x10;
    lVar40 = auVar129._8_8_;
    auVar129._0_8_ = auVar129._0_8_ + 0x10;
    auVar129._8_8_ = lVar40 + 0x10;
    lVar40 = auVar114._8_8_;
    auVar114._0_8_ = auVar114._0_8_ + 0x10;
    auVar114._8_8_ = lVar40 + 0x10;
    lVar40 = auVar89._8_8_;
    auVar89._0_8_ = auVar89._0_8_ + 0x10;
    auVar89._8_8_ = lVar40 + 0x10;
    lVar40 = auVar72._8_8_;
    auVar72._0_8_ = auVar72._0_8_ + 0x10;
    auVar72._8_8_ = lVar40 + 0x10;
    lVar40 = auVar63._8_8_;
    auVar63._0_8_ = auVar63._0_8_ + 0x10;
    auVar63._8_8_ = lVar40 + 0x10;
    local_68 = local_68 + 0x10;
    local_74 = local_74 + 0x10;
    local_78 = local_78 + 0x10;
    uVar301 = uVar301 + 0x10;
    uVar302 = uVar302 + 0x10;
    uVar303 = uVar303 + 0x10;
    uVar304 = uVar304 + 0x10;
    uVar305 = uVar305 + 0x10;
    uVar306 = uVar306 + 0x10;
    uVar377 = uVar377 + 0x10;
    uVar342 = uVar342 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar343 = uVar343 + 0x10;
    uVar300 = uVar300 + 0x10;
    uVar276 = uVar276 + 0x10;
  } while (lVar39 != 0x10000);
  buf[1] = -0x3b;
  buf[2] = -1;
  buf[3] = -2;
  pcVar51 = buf + 4;
  memcpy(buf + 4,str,0xfffe);
  pcVar43 = "0xfffe == len2";
  _ok(1,"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_decode_bin(x, %u))",0xfffe);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_00124afb:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_00124b1c:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_00124b0b;
LAB_00124b2c:
      unaff_RBP = (char *)0x10000;
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e98;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_00124b1c;
      if (uVar36 != 0xd9) goto LAB_00124b2c;
      goto LAB_00124afb;
    }
LAB_00124b0b:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0xfffe),"0xfffe == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_decode_strbin(x, %u))",0xfffe);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xfffe));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xfffe)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "mp_check_bin(mp_encode_bin(x, 0xfffe))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10002),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_decode_bin(x, 0xfffe)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10002)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_next_bin(x, 0xfffe)");
  _ok((uint)(local_70 == buf + 0x10002),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "len(mp_check_bin(x, 0xfffe)");
  _ok(1,"mp_sizeof_bin(0xfffe) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "mp_sizeof_bin(0xfffe)");
  iVar37 = bcmp(str,buf + 4,0xfffe);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xfffe) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x241,
      "mp_encode_bin(x, 0xfffe) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0xffff",0xe,1,_stdout);
  iVar37 = fputc(10,_stdout);
  auVar281 = _DAT_0013f1c0;
  uVar276 = (ushort)((uint)iVar37 >> 0x10);
  local_68 = CONCAT22(uVar276,0xf);
  local_74 = CONCAT22(uVar276,0xe);
  local_78 = (uint)CONCAT62((uint6)uVar276,0xd);
  uVar301 = 0xc;
  uVar302 = 0xb;
  uVar303 = 10;
  uVar304 = 9;
  uVar305 = 8;
  uVar306 = 7;
  uVar343 = 6;
  uVar342 = 5;
  uVar36 = 4;
  uVar377 = 3;
  uVar300 = 2;
  uVar276 = 1;
  auVar64 = _DAT_0013f230;
  auVar73 = _DAT_0013f240;
  auVar90 = _DAT_0013f250;
  auVar115 = _DAT_0013f260;
  auVar130 = _DAT_0013f270;
  auVar137 = _DAT_0013f280;
  auVar158 = _DAT_0013f290;
  auVar183 = _DAT_0013f1b0;
  do {
    auVar177 = auVar183 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar268._4_4_ = iVar37;
    auVar268._0_4_ = iVar37;
    auVar268._8_4_ = iVar77;
    auVar268._12_4_ = iVar77;
    auVar292._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar292._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar292._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar292._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar236._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar236._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar236._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar236._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar236 = auVar236 & auVar292;
    auVar177 = pshuflw(auVar268,auVar236,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    cVar118 = (char)lVar39;
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39] = ((char)(((uint)lVar39 & 0xffff) / 0x1a) * -0x1a + 0x60U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar236,auVar236);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 8 & 1) != 0) {
      str[lVar39 + 1] = (char)(uVar276 / 0x1a) * -0x1a + 'b' + cVar118;
    }
    auVar177 = auVar158 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar269._4_4_ = iVar37;
    auVar269._0_4_ = iVar37;
    auVar269._8_4_ = iVar77;
    auVar269._12_4_ = iVar77;
    auVar293._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar293._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar293._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar293._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar237._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar237._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar237._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar237._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar237 = auVar237 & auVar293;
    auVar177 = packssdw(auVar269,auVar237);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x10 & 1) != 0) {
      str[lVar39 + 2] = ((char)(uVar300 / 0x1a) * -0x1a + 0x62U | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar237,auVar237,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x18 & 1) != 0) {
      str[lVar39 + 3] = (char)(uVar377 / 0x1a) * -0x1a + 'd' + cVar118;
    }
    auVar177 = auVar137 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar270._4_4_ = iVar37;
    auVar270._0_4_ = iVar37;
    auVar270._8_4_ = iVar77;
    auVar270._12_4_ = iVar77;
    auVar294._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar294._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar294._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar294._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar238._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar238._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar238._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar238._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar238 = auVar238 & auVar294;
    auVar177 = pshuflw(auVar270,auVar238,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 4] = ((char)((uVar36 & 0xffff) / 0x1a) * -0x1a + 100U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar238,auVar238);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._4_2_ >> 8 & 1) != 0) {
      str[lVar39 + 5] = (char)(uVar342 / 0x1a) * -0x1a + 'f' + cVar118;
    }
    auVar177 = auVar130 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar271._4_4_ = iVar37;
    auVar271._0_4_ = iVar37;
    auVar271._8_4_ = iVar77;
    auVar271._12_4_ = iVar77;
    auVar295._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar295._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar295._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar295._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar239._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar239._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar239._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar239._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar239 = auVar239 & auVar295;
    auVar177 = packssdw(auVar271,auVar239);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 6] = ((char)(uVar343 / 0x1a) * -0x1a + 0x66U | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar239,auVar239,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._6_2_ >> 8 & 1) != 0) {
      str[lVar39 + 7] = (char)(uVar306 / 0x1a) * -0x1a + 'h' + cVar118;
    }
    auVar177 = auVar115 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar272._4_4_ = iVar37;
    auVar272._0_4_ = iVar37;
    auVar272._8_4_ = iVar77;
    auVar272._12_4_ = iVar77;
    auVar296._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar296._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar296._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar296._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar240._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar240._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar240._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar240._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar240 = auVar240 & auVar296;
    auVar177 = pshuflw(auVar272,auVar240,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[lVar39 + 8] = ((char)(uVar305 / 0x1a) * -0x1a + 0x68U | 1) + cVar118;
    }
    auVar177 = packssdw(auVar240,auVar240);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._8_2_ >> 8 & 1) != 0) {
      str[lVar39 + 9] = (char)(uVar304 / 0x1a) * -0x1a + 'j' + cVar118;
    }
    auVar177 = auVar90 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar273._4_4_ = iVar37;
    auVar273._0_4_ = iVar37;
    auVar273._8_4_ = iVar77;
    auVar273._12_4_ = iVar77;
    auVar297._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar297._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar297._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar297._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar241._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar241._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar241._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar241._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar241 = auVar241 & auVar297;
    auVar177 = packssdw(auVar273,auVar241);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[lVar39 + 10] = ((char)(uVar303 / 0x1a) * -0x1a + 0x6aU | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar241,auVar241,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._10_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xb] = (char)(uVar302 / 0x1a) * -0x1a + 'l' + cVar118;
    }
    auVar177 = auVar73 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar274._4_4_ = iVar37;
    auVar274._0_4_ = iVar37;
    auVar274._8_4_ = iVar77;
    auVar274._12_4_ = iVar77;
    auVar298._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar298._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar298._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar298._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar242._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar242._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar242._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar242._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar242 = auVar242 & auVar298;
    auVar177 = pshuflw(auVar274,auVar242,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xc] = ((char)(uVar301 / 0x1a) * -0x1a + 0x6cU | 1) + cVar118;
    }
    auVar177 = packssdw(auVar242,auVar242);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._12_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xd] = (char)((local_78 & 0xffff) / 0x1a) * -0x1a + 'n' + cVar118;
    }
    auVar177 = auVar64 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar275._4_4_ = iVar37;
    auVar275._0_4_ = iVar37;
    auVar275._8_4_ = iVar77;
    auVar275._12_4_ = iVar77;
    auVar299._0_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar299._4_4_ = -(uint)(iVar37 < -0x7fff0001);
    auVar299._8_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar299._12_4_ = -(uint)(iVar77 < -0x7fff0001);
    auVar243._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar243._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar243._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar243._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar243 = auVar243 & auVar299;
    auVar177 = packssdw(auVar275,auVar243);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[lVar39 + 0xe] = ((char)((local_74 & 0xffff) / 0x1a) * -0x1a + 0x6eU | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar243,auVar243,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._14_2_ >> 8 & 1) != 0) {
      str[lVar39 + 0xf] = (char)((local_68 & 0xffff) / 0x1a) * -0x1a + 'p' + cVar118;
    }
    lVar39 = lVar39 + 0x10;
    lVar40 = auVar183._8_8_;
    auVar183._0_8_ = auVar183._0_8_ + 0x10;
    auVar183._8_8_ = lVar40 + 0x10;
    lVar40 = auVar158._8_8_;
    auVar158._0_8_ = auVar158._0_8_ + 0x10;
    auVar158._8_8_ = lVar40 + 0x10;
    lVar40 = auVar137._8_8_;
    auVar137._0_8_ = auVar137._0_8_ + 0x10;
    auVar137._8_8_ = lVar40 + 0x10;
    lVar40 = auVar130._8_8_;
    auVar130._0_8_ = auVar130._0_8_ + 0x10;
    auVar130._8_8_ = lVar40 + 0x10;
    lVar40 = auVar115._8_8_;
    auVar115._0_8_ = auVar115._0_8_ + 0x10;
    auVar115._8_8_ = lVar40 + 0x10;
    lVar40 = auVar90._8_8_;
    auVar90._0_8_ = auVar90._0_8_ + 0x10;
    auVar90._8_8_ = lVar40 + 0x10;
    lVar40 = auVar73._8_8_;
    auVar73._0_8_ = auVar73._0_8_ + 0x10;
    auVar73._8_8_ = lVar40 + 0x10;
    lVar40 = auVar64._8_8_;
    auVar64._0_8_ = auVar64._0_8_ + 0x10;
    auVar64._8_8_ = lVar40 + 0x10;
    local_68 = local_68 + 0x10;
    local_74 = local_74 + 0x10;
    local_78 = local_78 + 0x10;
    uVar301 = uVar301 + 0x10;
    uVar302 = uVar302 + 0x10;
    uVar303 = uVar303 + 0x10;
    uVar304 = uVar304 + 0x10;
    uVar305 = uVar305 + 0x10;
    uVar306 = uVar306 + 0x10;
    uVar343 = uVar343 + 0x10;
    uVar342 = uVar342 + 0x10;
    uVar36 = uVar36 + 0x10;
    uVar377 = uVar377 + 0x10;
    uVar300 = uVar300 + 0x10;
    uVar276 = uVar276 + 0x10;
  } while (lVar39 != 0x10000);
  buf[1] = -0x3b;
  buf[2] = -1;
  buf[3] = -1;
  pcVar51 = buf + 4;
  memcpy(buf + 4,str,0xffff);
  pcVar43 = "0xffff == len2";
  _ok(1,"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_decode_bin(x, %u))",0xffff);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_001254d3:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_001254f4:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_001254e3;
LAB_00125504:
      unaff_RBP = (char *)0x10000;
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126e9d;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_001254f4;
      if (uVar36 != 0xd9) goto LAB_00125504;
      goto LAB_001254d3;
    }
LAB_001254e3:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0xffff),"0xffff == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_decode_strbin(x, %u))",0xffff);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0xffff));
  lVar39 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0xffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "mp_check_bin(mp_encode_bin(x, 0xffff))");
  unaff_RBP = buf + 0x10003;
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10003),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_decode_bin(x, 0xffff)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10003)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_next_bin(x, 0xffff)");
  _ok((uint)(local_70 == buf + 0x10003),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "len(mp_check_bin(x, 0xffff)");
  _ok(1,"mp_sizeof_bin(0xffff) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "mp_sizeof_bin(0xffff)");
  pcVar51 = buf + 4;
  iVar37 = bcmp(str,buf + 4,0xffff);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0xffff) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x242,
      "mp_encode_bin(x, 0xffff) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0x10000",0xf,1,_stdout);
  fputc(10,_stdout);
  auVar281 = _DAT_0013f3a0;
  auVar65 = _DAT_0013f380;
  auVar74 = _DAT_0013f390;
  do {
    auVar177 = pmulhuw(auVar74,auVar281);
    sVar133 = auVar74._0_2_ + (auVar177._0_2_ >> 3) * -0x1a;
    sVar141 = auVar74._2_2_;
    sVar140 = sVar141 + (auVar177._2_2_ >> 3) * -0x1a;
    sVar143 = auVar74._4_2_;
    sVar142 = sVar143 + (auVar177._4_2_ >> 3) * -0x1a;
    sVar145 = auVar74._6_2_;
    sVar144 = sVar145 + (auVar177._6_2_ >> 3) * -0x1a;
    sVar147 = auVar74._8_2_;
    sVar146 = sVar147 + (auVar177._8_2_ >> 3) * -0x1a;
    sVar149 = auVar74._10_2_;
    sVar148 = sVar149 + (auVar177._10_2_ >> 3) * -0x1a;
    sVar151 = auVar74._12_2_;
    sVar153 = auVar74._14_2_;
    sVar150 = sVar151 + (auVar177._12_2_ >> 3) * -0x1a;
    sVar152 = sVar153 + (auVar177._14_2_ >> 3) * -0x1a;
    auVar177 = pmulhuw(auVar65,auVar281);
    sVar154 = auVar65._0_2_ + (auVar177._0_2_ >> 3) * -0x1a;
    sVar162 = auVar65._2_2_;
    sVar161 = sVar162 + (auVar177._2_2_ >> 3) * -0x1a;
    sVar164 = auVar65._4_2_;
    sVar163 = sVar164 + (auVar177._4_2_ >> 3) * -0x1a;
    sVar166 = auVar65._6_2_;
    sVar165 = sVar166 + (auVar177._6_2_ >> 3) * -0x1a;
    sVar168 = auVar65._8_2_;
    sVar167 = sVar168 + (auVar177._8_2_ >> 3) * -0x1a;
    sVar170 = auVar65._10_2_;
    sVar169 = sVar170 + (auVar177._10_2_ >> 3) * -0x1a;
    sVar172 = auVar65._12_2_;
    sVar174 = auVar65._14_2_;
    sVar171 = sVar172 + (auVar177._12_2_ >> 3) * -0x1a;
    sVar173 = sVar174 + (auVar177._14_2_ >> 3) * -0x1a;
    str[lVar39] = ((0 < sVar133) * (sVar133 < 0x100) * (char)sVar133 - (0xff < sVar133)) + 'a';
    str[lVar39 + 1] = ((0 < sVar140) * (sVar140 < 0x100) * (char)sVar140 - (0xff < sVar140)) + 'a';
    str[lVar39 + 2] = ((0 < sVar142) * (sVar142 < 0x100) * (char)sVar142 - (0xff < sVar142)) + 'a';
    str[lVar39 + 3] = ((0 < sVar144) * (sVar144 < 0x100) * (char)sVar144 - (0xff < sVar144)) + 'a';
    str[lVar39 + 4] = ((0 < sVar146) * (sVar146 < 0x100) * (char)sVar146 - (0xff < sVar146)) + 'a';
    str[lVar39 + 5] = ((0 < sVar148) * (sVar148 < 0x100) * (char)sVar148 - (0xff < sVar148)) + 'a';
    str[lVar39 + 6] = ((0 < sVar150) * (sVar150 < 0x100) * (char)sVar150 - (0xff < sVar150)) + 'a';
    str[lVar39 + 7] = ((0 < sVar152) * (sVar152 < 0x100) * (char)sVar152 - (0xff < sVar152)) + 'a';
    str[lVar39 + 8] = ((0 < sVar154) * (sVar154 < 0x100) * (char)sVar154 - (0xff < sVar154)) + 'a';
    str[lVar39 + 9] = ((0 < sVar161) * (sVar161 < 0x100) * (char)sVar161 - (0xff < sVar161)) + 'a';
    str[lVar39 + 10] = ((0 < sVar163) * (sVar163 < 0x100) * (char)sVar163 - (0xff < sVar163)) + 'a';
    str[lVar39 + 0xb] = ((0 < sVar165) * (sVar165 < 0x100) * (char)sVar165 - (0xff < sVar165)) + 'a'
    ;
    str[lVar39 + 0xc] = ((0 < sVar167) * (sVar167 < 0x100) * (char)sVar167 - (0xff < sVar167)) + 'a'
    ;
    str[lVar39 + 0xd] = ((0 < sVar169) * (sVar169 < 0x100) * (char)sVar169 - (0xff < sVar169)) + 'a'
    ;
    str[lVar39 + 0xe] = ((0 < sVar171) * (sVar171 < 0x100) * (char)sVar171 - (0xff < sVar171)) + 'a'
    ;
    str[lVar39 + 0xf] = ((0 < sVar173) * (sVar173 < 0x100) * (char)sVar173 - (0xff < sVar173)) + 'a'
    ;
    lVar39 = lVar39 + 0x10;
    auVar74._0_2_ = auVar74._0_2_ + 0x10;
    auVar74._2_2_ = sVar141 + 0x10;
    auVar74._4_2_ = sVar143 + 0x10;
    auVar74._6_2_ = sVar145 + 0x10;
    auVar74._8_2_ = sVar147 + 0x10;
    auVar74._10_2_ = sVar149 + 0x10;
    auVar74._12_2_ = sVar151 + 0x10;
    auVar74._14_2_ = sVar153 + 0x10;
    auVar65._0_2_ = auVar65._0_2_ + 0x10;
    auVar65._2_2_ = sVar162 + 0x10;
    auVar65._4_2_ = sVar164 + 0x10;
    auVar65._6_2_ = sVar166 + 0x10;
    auVar65._8_2_ = sVar168 + 0x10;
    auVar65._10_2_ = sVar170 + 0x10;
    auVar65._12_2_ = sVar172 + 0x10;
    auVar65._14_2_ = sVar174 + 0x10;
  } while (lVar39 != 0x10000);
  buf[1] = -0x3a;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\0';
  memcpy(buf + 6,str,0x10000);
  pcVar43 = "0x10000 == len2";
  _ok(1,"0x10000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_decode_bin(x, %u))",0x10000);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 == 0xc4) {
LAB_0012584f:
      uVar36 = (uint)(byte)buf[2];
      pcVar51 = buf + 3;
    }
    else if (uVar36 == 0xc5) {
LAB_0012586c:
      uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
    }
    else {
      if (uVar36 == 0xc6) goto LAB_0012585f;
LAB_0012587c:
      if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126ea2;
      uVar36 = uVar36 & 0x1f;
      pcVar51 = buf + 2;
    }
  }
  else {
    if (uVar36 != 0xdb) {
      if (uVar36 == 0xda) goto LAB_0012586c;
      if (uVar36 != 0xd9) goto LAB_0012587c;
      goto LAB_0012584f;
    }
LAB_0012585f:
    uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
    uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
             CONCAT13(buf[5],uVar22) << 0x18;
    pcVar51 = buf + 6;
  }
  _ok((uint)(uVar36 == 0x10000),"0x10000 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_decode_strbin(x, %u))",0x10000);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x10000));
  uVar52 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x10000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "mp_check_bin(mp_encode_bin(x, 0x10000))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10006),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_decode_bin(x, 0x10000)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10006)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_next_bin(x, 0x10000)");
  _ok((uint)(local_70 == buf + 0x10006),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "len(mp_check_bin(x, 0x10000)");
  local_68._0_2_ = 1;
  local_68._2_2_ = 0;
  _ok(1,"mp_sizeof_bin(0x10000) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "mp_sizeof_bin(0x10000)");
  iVar37 = bcmp(str,buf + 6,0x10000);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x10000) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x243,
      "mp_encode_bin(x, 0x10000) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin len=0x10001",0xf,1,_stdout);
  local_74 = 10;
  fputc(10,_stdout);
  auVar281 = _DAT_0013f1c0;
  local_78 = 0xf;
  uVar53 = 0xe;
  uVar41 = 0xd;
  uVar44 = 0xc;
  uVar46 = 0xb;
  uVar47 = 9;
  uVar48 = 8;
  uVar49 = 7;
  uVar50 = 6;
  uVar54 = 5;
  uVar42 = 4;
  uVar55 = 3;
  unaff_RBP = (char *)0x2;
  auVar66 = _DAT_0013f230;
  auVar75 = _DAT_0013f240;
  auVar91 = _DAT_0013f250;
  auVar116 = _DAT_0013f260;
  auVar131 = _DAT_0013f270;
  auVar138 = _DAT_0013f280;
  auVar159 = _DAT_0013f290;
  auVar184 = _DAT_0013f1b0;
  do {
    auVar177 = auVar184 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar212._4_4_ = iVar37;
    auVar212._0_4_ = iVar37;
    auVar212._8_4_ = iVar77;
    auVar212._12_4_ = iVar77;
    auVar244._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar244._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar244._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar244._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar192._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar192._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar192._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar192._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar192 = auVar192 & auVar244;
    auVar177 = pshuflw(auVar212,auVar192,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    cVar118 = (char)uVar52;
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[uVar52] = (0x60U - ((char)((uVar52 & 0xffffffff) / 0x1a) * '\x19' +
                             (char)((uVar52 & 0xffffffff) / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar192,auVar192);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 8 & 1) != 0) {
      str[uVar52 + 1] = ((char)(local_68 / 0x1a) * -0x19 - (char)(local_68 / 0x1a)) + 'b' + cVar118;
    }
    auVar177 = auVar159 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar213._4_4_ = iVar37;
    auVar213._0_4_ = iVar37;
    auVar213._8_4_ = iVar77;
    auVar213._12_4_ = iVar77;
    auVar245._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar245._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar245._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar245._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar193._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar193._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar193._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar193._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar193 = auVar193 & auVar245;
    auVar177 = packssdw(auVar213,auVar193);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x10 & 1) != 0) {
      str[uVar52 + 2] =
           (0x62U - ((char)((ulong)unaff_RBP / 0x1a) * '\x19' + (char)((ulong)unaff_RBP / 0x1a)) | 1
           ) + cVar118;
    }
    auVar177 = pshufhw(auVar193,auVar193,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x18 & 1) != 0) {
      str[uVar52 + 3] = ((char)(uVar55 / 0x1a) * -0x19 - (char)(uVar55 / 0x1a)) + 'd' + cVar118;
    }
    auVar177 = auVar138 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar214._4_4_ = iVar37;
    auVar214._0_4_ = iVar37;
    auVar214._8_4_ = iVar77;
    auVar214._12_4_ = iVar77;
    auVar246._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar246._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar246._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar246._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar194._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar194._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar194._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar194._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar194 = auVar194 & auVar246;
    auVar177 = pshuflw(auVar214,auVar194,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[uVar52 + 4] =
           (100U - ((char)(uVar42 / 0x1a) * '\x19' + (char)(uVar42 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar194,auVar194);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._4_2_ >> 8 & 1) != 0) {
      str[uVar52 + 5] = ((char)(uVar54 / 0x1a) * -0x19 - (char)(uVar54 / 0x1a)) + 'f' + cVar118;
    }
    auVar177 = auVar131 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar215._4_4_ = iVar37;
    auVar215._0_4_ = iVar37;
    auVar215._8_4_ = iVar77;
    auVar215._12_4_ = iVar77;
    auVar247._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar247._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar247._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar247._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar195._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar195._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar195._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar195._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar195 = auVar195 & auVar247;
    auVar177 = packssdw(auVar215,auVar195);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[uVar52 + 6] =
           (0x66U - ((char)(uVar50 / 0x1a) * '\x19' + (char)(uVar50 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar195,auVar195,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._6_2_ >> 8 & 1) != 0) {
      str[uVar52 + 7] = ((char)(uVar49 / 0x1a) * -0x19 - (char)(uVar49 / 0x1a)) + 'h' + cVar118;
    }
    auVar177 = auVar116 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar216._4_4_ = iVar37;
    auVar216._0_4_ = iVar37;
    auVar216._8_4_ = iVar77;
    auVar216._12_4_ = iVar77;
    auVar248._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar248._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar248._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar248._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar196._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar196._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar196._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar196._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar196 = auVar196 & auVar248;
    auVar177 = pshuflw(auVar216,auVar196,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[uVar52 + 8] =
           (0x68U - ((char)(uVar48 / 0x1a) * '\x19' + (char)(uVar48 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar196,auVar196);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._8_2_ >> 8 & 1) != 0) {
      str[uVar52 + 9] = ((char)(uVar47 / 0x1a) * -0x19 - (char)(uVar47 / 0x1a)) + 'j' + cVar118;
    }
    auVar177 = auVar91 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar217._4_4_ = iVar37;
    auVar217._0_4_ = iVar37;
    auVar217._8_4_ = iVar77;
    auVar217._12_4_ = iVar77;
    auVar249._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar249._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar249._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar249._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar197._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar197._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar197._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar197._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar197 = auVar197 & auVar249;
    auVar177 = packssdw(auVar217,auVar197);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[uVar52 + 10] =
           (0x6aU - ((char)(local_74 / 0x1a) * '\x19' + (char)(local_74 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar197,auVar197,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._10_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xb] = ((char)(uVar46 / 0x1a) * -0x19 - (char)(uVar46 / 0x1a)) + 'l' + cVar118;
    }
    auVar177 = auVar75 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar218._4_4_ = iVar37;
    auVar218._0_4_ = iVar37;
    auVar218._8_4_ = iVar77;
    auVar218._12_4_ = iVar77;
    auVar250._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar250._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar250._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar250._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar198._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar198._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar198._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar198._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar198 = auVar198 & auVar250;
    auVar177 = pshuflw(auVar218,auVar198,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[uVar52 + 0xc] =
           (0x6cU - ((char)(uVar44 / 0x1a) * '\x19' + (char)(uVar44 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar198,auVar198);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._12_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xd] = ((char)(uVar41 / 0x1a) * -0x19 - (char)(uVar41 / 0x1a)) + 'n' + cVar118;
    }
    auVar177 = auVar66 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar219._4_4_ = iVar37;
    auVar219._0_4_ = iVar37;
    auVar219._8_4_ = iVar77;
    auVar219._12_4_ = iVar77;
    auVar251._0_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar251._4_4_ = -(uint)(iVar37 < -0x7ffeffff);
    auVar251._8_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar251._12_4_ = -(uint)(iVar77 < -0x7ffeffff);
    auVar199._0_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar199._4_4_ = -(uint)(auVar177._4_4_ == -0x80000000);
    auVar199._8_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar199._12_4_ = -(uint)(auVar177._12_4_ == -0x80000000);
    auVar199 = auVar199 & auVar251;
    auVar177 = packssdw(auVar219,auVar199);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[uVar52 + 0xe] =
           (0x6eU - ((char)(uVar53 / 0x1a) * '\x19' + (char)(uVar53 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar199,auVar199,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._14_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xf] =
           ((char)(local_78 / 0x1a) * -0x19 - (char)(local_78 / 0x1a)) + 'p' + cVar118;
    }
    uVar52 = uVar52 + 0x10;
    lVar39 = auVar184._8_8_;
    auVar184._0_8_ = auVar184._0_8_ + 0x10;
    auVar184._8_8_ = lVar39 + 0x10;
    lVar39 = auVar159._8_8_;
    auVar159._0_8_ = auVar159._0_8_ + 0x10;
    auVar159._8_8_ = lVar39 + 0x10;
    lVar39 = auVar138._8_8_;
    auVar138._0_8_ = auVar138._0_8_ + 0x10;
    auVar138._8_8_ = lVar39 + 0x10;
    lVar39 = auVar131._8_8_;
    auVar131._0_8_ = auVar131._0_8_ + 0x10;
    auVar131._8_8_ = lVar39 + 0x10;
    lVar39 = auVar116._8_8_;
    auVar116._0_8_ = auVar116._0_8_ + 0x10;
    auVar116._8_8_ = lVar39 + 0x10;
    lVar39 = auVar91._8_8_;
    auVar91._0_8_ = auVar91._0_8_ + 0x10;
    auVar91._8_8_ = lVar39 + 0x10;
    lVar39 = auVar75._8_8_;
    auVar75._0_8_ = auVar75._0_8_ + 0x10;
    auVar75._8_8_ = lVar39 + 0x10;
    lVar39 = auVar66._8_8_;
    auVar66._0_8_ = auVar66._0_8_ + 0x10;
    auVar66._8_8_ = lVar39 + 0x10;
    local_78 = local_78 + 0x10;
    uVar53 = (ulong)((int)uVar53 + 0x10);
    uVar41 = (ulong)((int)uVar41 + 0x10);
    uVar44 = (ulong)((int)uVar44 + 0x10);
    uVar46 = (ulong)((int)uVar46 + 0x10);
    local_74 = local_74 + 0x10;
    uVar47 = (ulong)((int)uVar47 + 0x10);
    uVar48 = (ulong)((int)uVar48 + 0x10);
    uVar49 = (ulong)((int)uVar49 + 0x10);
    uVar50 = (ulong)((int)uVar50 + 0x10);
    uVar54 = (ulong)((int)uVar54 + 0x10);
    uVar42 = (ulong)((int)uVar42 + 0x10);
    uVar55 = (ulong)((int)uVar55 + 0x10);
    unaff_RBP = (char *)(ulong)((int)unaff_RBP + 0x10);
    local_68 = local_68 + 0x10;
  } while (uVar52 != 0x10010);
  local_58 = -0x80000000;
  iStack_54 = -0x80000000;
  iStack_50 = -0x80000000;
  iStack_4c = -0x80000000;
  local_48 = -0x7ffeffff;
  iStack_44 = -0x7ffeffff;
  iStack_40 = -0x7ffeffff;
  iStack_3c = -0x7ffeffff;
  buf[1] = -0x3a;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\x01';
  pcVar51 = buf + 6;
  memcpy(buf + 6,str,0x10001);
  pcVar43 = "0x10001 == len2";
  _ok(1,"0x10001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_decode_bin(x, %u))",0x10001);
  uVar36 = (uint)(byte)buf[1];
  if (uVar36 < 0xd9) {
    if (uVar36 != 0xc4) {
      if (uVar36 == 0xc5) {
LAB_001262b0:
        uVar36 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
        pcVar51 = buf + 4;
      }
      else {
        if (uVar36 == 0xc6) goto LAB_001262a6;
LAB_001262c7:
        if ((byte)(buf[1] + 0x40U) < 0xe0) goto LAB_00126ea7;
        uVar36 = uVar36 & 0x1f;
        pcVar51 = buf + 2;
      }
      goto LAB_001262dd;
    }
  }
  else {
    if (uVar36 == 0xdb) {
LAB_001262a6:
      uVar22 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar36 = (uint)(byte)buf[5] | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
               CONCAT13(buf[5],uVar22) << 0x18;
      goto LAB_001262dd;
    }
    if (uVar36 == 0xda) goto LAB_001262b0;
    if (uVar36 != 0xd9) goto LAB_001262c7;
  }
  uVar36 = (uint)(byte)buf[2];
  pcVar51 = buf + 3;
LAB_001262dd:
  _ok((uint)(uVar36 == 0x10001),"0x10001 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_decode_strbin(x, %u))",0x10001);
  iVar45 = 1;
  local_80 = (byte *)(buf + 1);
  do {
    pbVar38 = local_80 + 1;
    lVar39 = (long)""[*local_80];
    if (lVar39 < 0) {
      if (*local_80 == 0xd9) {
        pbVar38 = local_80 + (ulong)local_80[1] + 2;
      }
      else {
        if ((byte)""[*local_80] < 0xe1) {
          mp_next_slowpath((char **)&local_80,iVar45);
          break;
        }
        iVar45 = iVar45 - lVar39;
      }
    }
    else {
      pbVar38 = pbVar38 + lVar39;
    }
    bVar101 = 1 < iVar45;
    iVar45 = iVar45 + -1;
    local_80 = pbVar38;
  } while (bVar101);
  local_70 = buf + 1;
  iVar37 = mp_check(&local_70,(char *)(local_80 + 0x10001));
  uVar52 = 0;
  _ok((uint)(iVar37 == 0),"!mp_check(&d4, d3 + 0x10001)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "mp_check_bin(mp_encode_bin(x, 0x10001))");
  _ok((uint)(pcVar51 + uVar36 == buf + 0x10007),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_decode_bin(x, 0x10001)");
  _ok((uint)(local_80 == (byte *)(buf + 0x10007)),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_next_bin(x, 0x10001)");
  _ok((uint)(local_70 == buf + 0x10007),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "len(mp_check_bin(x, 0x10001)");
  local_68._0_2_ = 1;
  local_68._2_2_ = 0;
  _ok(1,"mp_sizeof_bin(0x10001) == (uint32_t) (d1 - data)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "mp_sizeof_bin(0x10001)");
  iVar37 = bcmp(str,buf + 6,0x10001);
  _ok((uint)(iVar37 == 0),"memcmp(s1, s2, 0x10001) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x244,
      "mp_encode_bin(x, 0x10001) == x");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("bin_safe",8,1,_stdout);
  local_74 = 10;
  fputc(10,_stdout);
  auVar281 = _DAT_0013f1c0;
  local_78 = 0xf;
  uVar53 = 0xe;
  uVar41 = 0xd;
  uVar44 = 0xc;
  uVar46 = 0xb;
  uVar47 = 9;
  uVar48 = 8;
  uVar49 = 7;
  uVar50 = 6;
  uVar56 = 5;
  uVar54 = 4;
  uVar55 = 3;
  uVar42 = 2;
  auVar67 = _DAT_0013f230;
  auVar76 = _DAT_0013f240;
  auVar92 = _DAT_0013f250;
  auVar117 = _DAT_0013f260;
  auVar132 = _DAT_0013f270;
  auVar139 = _DAT_0013f280;
  auVar160 = _DAT_0013f290;
  auVar185 = _DAT_0013f1b0;
  do {
    auVar177 = auVar185 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar220._4_4_ = iVar37;
    auVar220._0_4_ = iVar37;
    auVar220._8_4_ = iVar77;
    auVar220._12_4_ = iVar77;
    auVar252._0_4_ = -(uint)(iVar37 < local_48);
    auVar252._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar252._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar252._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar200._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar200._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar200._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar200._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar200 = auVar200 & auVar252;
    auVar177 = pshuflw(auVar220,auVar200,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    cVar118 = (char)uVar52;
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[uVar52] = (0x60U - ((char)((uVar52 & 0xffffffff) / 0x1a) * '\x19' +
                             (char)((uVar52 & 0xffffffff) / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar200,auVar200);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 8 & 1) != 0) {
      str[uVar52 + 1] = ((char)(local_68 / 0x1a) * -0x19 - (char)(local_68 / 0x1a)) + 'b' + cVar118;
    }
    auVar177 = auVar160 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar221._4_4_ = iVar37;
    auVar221._0_4_ = iVar37;
    auVar221._8_4_ = iVar77;
    auVar221._12_4_ = iVar77;
    auVar253._0_4_ = -(uint)(iVar37 < local_48);
    auVar253._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar253._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar253._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar201._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar201._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar201._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar201._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar201 = auVar201 & auVar253;
    auVar177 = packssdw(auVar221,auVar201);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x10 & 1) != 0) {
      str[uVar52 + 2] =
           (0x62U - ((char)(uVar42 / 0x1a) * '\x19' + (char)(uVar42 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar201,auVar201,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._0_4_ >> 0x18 & 1) != 0) {
      str[uVar52 + 3] = ((char)(uVar55 / 0x1a) * -0x19 - (char)(uVar55 / 0x1a)) + 'd' + cVar118;
    }
    auVar177 = auVar139 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar222._4_4_ = iVar37;
    auVar222._0_4_ = iVar37;
    auVar222._8_4_ = iVar77;
    auVar222._12_4_ = iVar77;
    auVar254._0_4_ = -(uint)(iVar37 < local_48);
    auVar254._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar254._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar254._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar202._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar202._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar202._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar202._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar202 = auVar202 & auVar254;
    auVar177 = pshuflw(auVar222,auVar202,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[uVar52 + 4] =
           (100U - ((char)(uVar54 / 0x1a) * '\x19' + (char)(uVar54 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar202,auVar202);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._4_2_ >> 8 & 1) != 0) {
      str[uVar52 + 5] = ((char)(uVar56 / 0x1a) * -0x19 - (char)(uVar56 / 0x1a)) + 'f' + cVar118;
    }
    auVar177 = auVar132 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar223._4_4_ = iVar37;
    auVar223._0_4_ = iVar37;
    auVar223._8_4_ = iVar77;
    auVar223._12_4_ = iVar77;
    auVar255._0_4_ = -(uint)(iVar37 < local_48);
    auVar255._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar255._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar255._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar203._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar203._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar203._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar203._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar203 = auVar203 & auVar255;
    auVar177 = packssdw(auVar223,auVar203);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[uVar52 + 6] =
           (0x66U - ((char)(uVar50 / 0x1a) * '\x19' + (char)(uVar50 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar203,auVar203,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._6_2_ >> 8 & 1) != 0) {
      str[uVar52 + 7] = ((char)(uVar49 / 0x1a) * -0x19 - (char)(uVar49 / 0x1a)) + 'h' + cVar118;
    }
    auVar177 = auVar117 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar224._4_4_ = iVar37;
    auVar224._0_4_ = iVar37;
    auVar224._8_4_ = iVar77;
    auVar224._12_4_ = iVar77;
    auVar256._0_4_ = -(uint)(iVar37 < local_48);
    auVar256._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar256._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar256._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar204._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar204._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar204._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar204._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar204 = auVar204 & auVar256;
    auVar177 = pshuflw(auVar224,auVar204,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      str[uVar52 + 8] =
           (0x68U - ((char)(uVar48 / 0x1a) * '\x19' + (char)(uVar48 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar204,auVar204);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._8_2_ >> 8 & 1) != 0) {
      str[uVar52 + 9] = ((char)(uVar47 / 0x1a) * -0x19 - (char)(uVar47 / 0x1a)) + 'j' + cVar118;
    }
    auVar177 = auVar92 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar225._4_4_ = iVar37;
    auVar225._0_4_ = iVar37;
    auVar225._8_4_ = iVar77;
    auVar225._12_4_ = iVar77;
    auVar257._0_4_ = -(uint)(iVar37 < local_48);
    auVar257._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar257._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar257._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar205._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar205._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar205._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar205._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar205 = auVar205 & auVar257;
    auVar177 = packssdw(auVar225,auVar205);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      str[uVar52 + 10] =
           (0x6aU - ((char)(local_74 / 0x1a) * '\x19' + (char)(local_74 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar205,auVar205,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._10_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xb] = ((char)(uVar46 / 0x1a) * -0x19 - (char)(uVar46 / 0x1a)) + 'l' + cVar118;
    }
    auVar177 = auVar76 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar226._4_4_ = iVar37;
    auVar226._0_4_ = iVar37;
    auVar226._8_4_ = iVar77;
    auVar226._12_4_ = iVar77;
    auVar258._0_4_ = -(uint)(iVar37 < local_48);
    auVar258._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar258._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar258._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar206._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar206._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar206._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar206._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar206 = auVar206 & auVar258;
    auVar177 = pshuflw(auVar226,auVar206,0xe8);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      str[uVar52 + 0xc] =
           (0x6cU - ((char)(uVar44 / 0x1a) * '\x19' + (char)(uVar44 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = packssdw(auVar206,auVar206);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._12_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xd] = ((char)(uVar41 / 0x1a) * -0x19 - (char)(uVar41 / 0x1a)) + 'n' + cVar118;
    }
    auVar177 = auVar67 ^ auVar281;
    iVar37 = auVar177._0_4_;
    iVar77 = auVar177._8_4_;
    auVar227._4_4_ = iVar37;
    auVar227._0_4_ = iVar37;
    auVar227._8_4_ = iVar77;
    auVar227._12_4_ = iVar77;
    auVar259._0_4_ = -(uint)(iVar37 < local_48);
    auVar259._4_4_ = -(uint)(iVar37 < iStack_44);
    auVar259._8_4_ = -(uint)(iVar77 < iStack_40);
    auVar259._12_4_ = -(uint)(iVar77 < iStack_3c);
    auVar207._0_4_ = -(uint)(auVar177._4_4_ == local_58);
    auVar207._4_4_ = -(uint)(auVar177._4_4_ == iStack_54);
    auVar207._8_4_ = -(uint)(auVar177._12_4_ == iStack_50);
    auVar207._12_4_ = -(uint)(auVar177._12_4_ == iStack_4c);
    auVar207 = auVar207 & auVar259;
    auVar177 = packssdw(auVar227,auVar207);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      str[uVar52 + 0xe] =
           (0x6eU - ((char)(uVar53 / 0x1a) * '\x19' + (char)(uVar53 / 0x1a)) | 1) + cVar118;
    }
    auVar177 = pshufhw(auVar207,auVar207,0x84);
    auVar177 = packssdw(auVar177,auVar177);
    auVar177 = packsswb(auVar177,auVar177);
    if ((auVar177._14_2_ >> 8 & 1) != 0) {
      str[uVar52 + 0xf] =
           ((char)(local_78 / 0x1a) * -0x19 - (char)(local_78 / 0x1a)) + 'p' + cVar118;
    }
    uVar52 = uVar52 + 0x10;
    lVar39 = auVar185._8_8_;
    auVar185._0_8_ = auVar185._0_8_ + 0x10;
    auVar185._8_8_ = lVar39 + 0x10;
    lVar39 = auVar160._8_8_;
    auVar160._0_8_ = auVar160._0_8_ + 0x10;
    auVar160._8_8_ = lVar39 + 0x10;
    lVar39 = auVar139._8_8_;
    auVar139._0_8_ = auVar139._0_8_ + 0x10;
    auVar139._8_8_ = lVar39 + 0x10;
    lVar39 = auVar132._8_8_;
    auVar132._0_8_ = auVar132._0_8_ + 0x10;
    auVar132._8_8_ = lVar39 + 0x10;
    lVar39 = auVar117._8_8_;
    auVar117._0_8_ = auVar117._0_8_ + 0x10;
    auVar117._8_8_ = lVar39 + 0x10;
    lVar39 = auVar92._8_8_;
    auVar92._0_8_ = auVar92._0_8_ + 0x10;
    auVar92._8_8_ = lVar39 + 0x10;
    lVar39 = auVar76._8_8_;
    auVar76._0_8_ = auVar76._0_8_ + 0x10;
    auVar76._8_8_ = lVar39 + 0x10;
    lVar39 = auVar67._8_8_;
    auVar67._0_8_ = auVar67._0_8_ + 0x10;
    auVar67._8_8_ = lVar39 + 0x10;
    local_78 = local_78 + 0x10;
    uVar53 = (ulong)((int)uVar53 + 0x10);
    uVar41 = (ulong)((int)uVar41 + 0x10);
    uVar44 = (ulong)((int)uVar44 + 0x10);
    uVar46 = (ulong)((int)uVar46 + 0x10);
    local_74 = local_74 + 0x10;
    uVar47 = (ulong)((int)uVar47 + 0x10);
    uVar48 = (ulong)((int)uVar48 + 0x10);
    uVar49 = (ulong)((int)uVar49 + 0x10);
    uVar50 = (ulong)((int)uVar50 + 0x10);
    uVar56 = (ulong)((int)uVar56 + 0x10);
    uVar54 = (ulong)((int)uVar54 + 0x10);
    uVar55 = (ulong)((int)uVar55 + 0x10);
    uVar42 = (ulong)((int)uVar42 + 0x10);
    local_68 = local_68 + 0x10;
  } while (uVar52 != 0x10010);
  local_80 = (byte *)CONCAT35(local_80._5_3_,0x1000100c6);
  _ok(1,"-sz == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "size after mp_encode_bin_safe(NULL, &sz)");
  _ok(1,"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "mp_encode_bin_safe(NULL, &sz)");
  buf[1] = -0x3a;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\x01';
  memcpy(buf + 6,str,0x10001);
  _ok(1,"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "size after mp_encode_bin_safe(buf, &sz)");
  _ok(1,"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "len of mp_encode_bin_safe(buf, &sz)");
  _ok((uint)(buf[5] == local_80._4_1_ &&
            CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == (int)local_80),
      "memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "head of mp_encode_bin_safe(buf, &sz)");
  iVar37 = bcmp(buf + 6,str,0x10001);
  _ok((uint)(iVar37 == 0),"memcmp(data + hl, str, (0x10001)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "payload of mp_encode_bin_safe(buf, &sz)");
  _ok(1,"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "size after mp_encode_bin_safe(buf, &sz) overflow");
  _ok(1,"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "mp_encode_bin_safe(buf, &sz) overflow");
  buf[1] = -0x3a;
  buf[2] = '\0';
  buf[3] = '\x01';
  buf[4] = '\0';
  buf[5] = '\x01';
  memcpy(buf + 6,str,0x10001);
  _ok(1,"(d - data) == rl",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "len of mp_encode_bin_safe(buf, NULL)");
  _ok((uint)(buf[5] == local_80._4_1_ &&
            CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == (int)local_80),
      "memcmp(data, head, hl) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "head of mp_encode_bin_safe(buf, NULL)");
  iVar37 = bcmp(buf + 6,str,0x10001);
  _ok((uint)(iVar37 == 0),"memcmp(data + hl, str, (0x10001)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x246,
      "payload of mp_encode_bin_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_bins");
  iVar37 = check_plan();
  return iVar37;
}

Assistant:

static int
test_bins(void)
{
	plan(12*8 + 11);
	header();

	test_bin(0x01);
	test_bin(0x1e);
	test_bin(0x1f);
	test_bin(0x20);
	test_bin(0xfe);
	test_bin(0xff);
	test_bin(0x100);
	test_bin(0x101);
	test_bin(0xfffe);
	test_bin(0xffff);
	test_bin(0x10000);
	test_bin(0x10001);

	test_bin_safe(0x10001);

	footer();
	return check_plan();
}